

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  float *pfVar2;
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined6 uVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  bool bVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  RTCIntersectArguments *pRVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  uint uVar49;
  short sVar50;
  float fVar51;
  undefined8 uVar52;
  float fVar89;
  vfloat_impl<4> p00;
  undefined2 uVar87;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  float fVar88;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  float fVar90;
  float fVar108;
  float fVar109;
  vfloat4 v;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float t1;
  float fVar110;
  float fVar111;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar123;
  float fVar128;
  float fVar129;
  vfloat4 v_1;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar130;
  float fVar143;
  float fVar144;
  vfloat4 a;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar145;
  float fVar159;
  float fVar160;
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar168;
  float fVar169;
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar170;
  float fVar195;
  float fVar196;
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar210;
  float fVar211;
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar212;
  float fVar223;
  float fVar224;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar225;
  float fVar231;
  float fVar232;
  vfloat4 a_1;
  float fVar233;
  float fVar234;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar235;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar245;
  float fVar246;
  float fVar252;
  undefined8 uVar247;
  float fVar251;
  float fVar253;
  float fVar255;
  undefined1 auVar248 [16];
  float fVar254;
  float fVar256;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar257;
  float fVar260;
  float fVar261;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p00_1;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  int local_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  ulong local_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined8 local_3a8;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2b8;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  undefined8 uStack_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  ulong local_280;
  RTCFilterFunctionNArguments local_278;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  float fStack_1f0;
  float fStack_1ec;
  float afStack_1e8 [4];
  undefined8 local_1d8;
  float local_1d0;
  float local_1cc;
  float fStack_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  uint local_1bc;
  uint local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar84 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 uVar86;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  
  PVar3 = prim[1];
  uVar41 = (ulong)(byte)PVar3;
  pPVar1 = prim + uVar41 * 0x19 + 6;
  fVar109 = *(float *)(pPVar1 + 0xc);
  fVar123 = ((ray->org).field_0.m128[0] - *(float *)pPVar1) * fVar109;
  fVar128 = ((ray->org).field_0.m128[1] - *(float *)(pPVar1 + 4)) * fVar109;
  fVar129 = ((ray->org).field_0.m128[2] - *(float *)(pPVar1 + 8)) * fVar109;
  fVar90 = fVar109 * (ray->dir).field_0.m128[0];
  fVar108 = fVar109 * (ray->dir).field_0.m128[1];
  fVar109 = fVar109 * (ray->dir).field_0.m128[2];
  uVar4 = *(undefined4 *)(prim + uVar41 * 4 + 6);
  uVar86 = (undefined1)((uint)uVar4 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar4 >> 0x10);
  uVar52 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar4));
  uVar86 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar52 >> 0x20),uVar86),uVar86);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar43;
  auVar96._12_2_ = uVar87;
  auVar96._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar52 >> 0x20);
  auVar214._12_4_ = auVar96._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar43;
  auVar214._10_2_ = uVar87;
  auVar60._10_6_ = auVar214._10_6_;
  auVar60._8_2_ = uVar87;
  auVar60._0_8_ = uVar43;
  uVar87 = (undefined2)uVar20;
  auVar21._4_8_ = auVar60._8_8_;
  auVar21._2_2_ = uVar87;
  auVar21._0_2_ = uVar87;
  fVar110 = (float)((int)sVar50 >> 8);
  fVar120 = (float)(auVar21._0_4_ >> 0x18);
  fVar121 = (float)(auVar60._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar41 * 5 + 6);
  uVar86 = (undefined1)((uint)uVar4 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar4 >> 0x10);
  uVar52 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar4));
  uVar86 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar52 >> 0x20),uVar86),uVar86);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar53._8_4_ = 0;
  auVar53._0_8_ = uVar43;
  auVar53._12_2_ = uVar87;
  auVar53._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar52 >> 0x20);
  auVar216._12_4_ = auVar53._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar43;
  auVar216._10_2_ = uVar87;
  auVar113._10_6_ = auVar216._10_6_;
  auVar113._8_2_ = uVar87;
  auVar113._0_8_ = uVar43;
  uVar87 = (undefined2)uVar20;
  auVar22._4_8_ = auVar113._8_8_;
  auVar22._2_2_ = uVar87;
  auVar22._0_2_ = uVar87;
  fVar130 = (float)((int)sVar50 >> 8);
  fVar143 = (float)(auVar22._0_4_ >> 0x18);
  fVar144 = (float)(auVar113._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar41 * 6 + 6);
  uVar86 = (undefined1)((uint)uVar4 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar4 >> 0x10);
  uVar52 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar4));
  uVar86 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar52 >> 0x20),uVar86),uVar86);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar56._8_4_ = 0;
  auVar56._0_8_ = uVar43;
  auVar56._12_2_ = uVar87;
  auVar56._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar52 >> 0x20);
  auVar55._12_4_ = auVar56._12_4_;
  auVar55._8_2_ = 0;
  auVar55._0_8_ = uVar43;
  auVar55._10_2_ = uVar87;
  auVar54._10_6_ = auVar55._10_6_;
  auVar54._8_2_ = uVar87;
  auVar54._0_8_ = uVar43;
  uVar87 = (undefined2)uVar20;
  auVar23._4_8_ = auVar54._8_8_;
  auVar23._2_2_ = uVar87;
  auVar23._0_2_ = uVar87;
  fVar145 = (float)((int)sVar50 >> 8);
  fVar159 = (float)(auVar23._0_4_ >> 0x18);
  fVar160 = (float)(auVar54._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar41 * 0xb + 6);
  uVar86 = (undefined1)((uint)uVar4 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar4 >> 0x10);
  uVar52 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar4));
  uVar86 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar52 >> 0x20),uVar86),uVar86);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar43;
  auVar59._12_2_ = uVar87;
  auVar59._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar52 >> 0x20);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar43;
  auVar58._10_2_ = uVar87;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._8_2_ = uVar87;
  auVar57._0_8_ = uVar43;
  uVar87 = (undefined2)uVar20;
  auVar24._4_8_ = auVar57._8_8_;
  auVar24._2_2_ = uVar87;
  auVar24._0_2_ = uVar87;
  fVar51 = (float)((int)sVar50 >> 8);
  fVar88 = (float)(auVar24._0_4_ >> 0x18);
  fVar89 = (float)(auVar57._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  uVar86 = (undefined1)((uint)uVar4 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar4 >> 0x10);
  uVar52 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar4));
  uVar86 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar52 >> 0x20),uVar86),uVar86);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar43;
  auVar164._12_2_ = uVar87;
  auVar164._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar52 >> 0x20);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar43;
  auVar163._10_2_ = uVar87;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._8_2_ = uVar87;
  auVar162._0_8_ = uVar43;
  uVar87 = (undefined2)uVar20;
  auVar25._4_8_ = auVar162._8_8_;
  auVar25._2_2_ = uVar87;
  auVar25._0_2_ = uVar87;
  fVar161 = (float)((int)sVar50 >> 8);
  fVar168 = (float)(auVar25._0_4_ >> 0x18);
  fVar169 = (float)(auVar162._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (uint)(byte)PVar3 * 0xc + uVar41 + 6);
  uVar86 = (undefined1)((uint)uVar4 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar4 >> 0x10);
  uVar52 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar4));
  uVar86 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar52 >> 0x20),uVar86),uVar86);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar43;
  auVar173._12_2_ = uVar87;
  auVar173._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar52 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar43;
  auVar172._10_2_ = uVar87;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar87;
  auVar171._0_8_ = uVar43;
  uVar87 = (undefined2)uVar20;
  auVar26._4_8_ = auVar171._8_8_;
  auVar26._2_2_ = uVar87;
  auVar26._0_2_ = uVar87;
  fVar212 = (float)((int)sVar50 >> 8);
  fVar223 = (float)(auVar26._0_4_ >> 0x18);
  fVar224 = (float)(auVar171._8_4_ >> 0x18);
  uVar39 = (ulong)(uint)((int)(uVar41 * 9) * 2);
  uVar4 = *(undefined4 *)(prim + uVar39 + 6);
  uVar86 = (undefined1)((uint)uVar4 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar4 >> 0x10);
  uVar52 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar4));
  uVar86 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar52 >> 0x20),uVar86),uVar86);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar43;
  auVar176._12_2_ = uVar87;
  auVar176._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar52 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar43;
  auVar175._10_2_ = uVar87;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar87;
  auVar174._0_8_ = uVar43;
  uVar87 = (undefined2)uVar20;
  auVar27._4_8_ = auVar174._8_8_;
  auVar27._2_2_ = uVar87;
  auVar27._0_2_ = uVar87;
  fVar197 = (float)((int)sVar50 >> 8);
  fVar210 = (float)(auVar27._0_4_ >> 0x18);
  fVar211 = (float)(auVar174._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar39 + uVar41 + 6);
  uVar86 = (undefined1)((uint)uVar4 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar4 >> 0x10);
  uVar52 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar4));
  uVar86 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar52 >> 0x20),uVar86),uVar86);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar43;
  auVar179._12_2_ = uVar87;
  auVar179._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar52 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar43;
  auVar178._10_2_ = uVar87;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar87;
  auVar177._0_8_ = uVar43;
  uVar87 = (undefined2)uVar20;
  auVar28._4_8_ = auVar177._8_8_;
  auVar28._2_2_ = uVar87;
  auVar28._0_2_ = uVar87;
  fVar225 = (float)((int)sVar50 >> 8);
  fVar231 = (float)(auVar28._0_4_ >> 0x18);
  fVar232 = (float)(auVar177._8_4_ >> 0x18);
  uVar39 = (ulong)(uint)((int)(uVar41 * 5) << 2);
  uVar4 = *(undefined4 *)(prim + uVar39 + 6);
  uVar86 = (undefined1)((uint)uVar4 >> 0x18);
  uVar87 = CONCAT11(uVar86,uVar86);
  uVar86 = (undefined1)((uint)uVar4 >> 0x10);
  uVar52 = CONCAT35(CONCAT21(uVar87,uVar86),CONCAT14(uVar86,uVar4));
  uVar86 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar52 >> 0x20),uVar86),uVar86);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar43;
  auVar182._12_2_ = uVar87;
  auVar182._14_2_ = uVar87;
  uVar87 = (undefined2)((ulong)uVar52 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar43;
  auVar181._10_2_ = uVar87;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar87;
  auVar180._0_8_ = uVar43;
  uVar87 = (undefined2)uVar20;
  auVar29._4_8_ = auVar180._8_8_;
  auVar29._2_2_ = uVar87;
  auVar29._0_2_ = uVar87;
  fVar257 = (float)((int)sVar50 >> 8);
  fVar260 = (float)(auVar29._0_4_ >> 0x18);
  fVar261 = (float)(auVar180._8_4_ >> 0x18);
  fVar245 = fVar90 * fVar110 + fVar108 * fVar130 + fVar109 * fVar145;
  fVar251 = fVar90 * fVar120 + fVar108 * fVar143 + fVar109 * fVar159;
  fVar253 = fVar90 * fVar121 + fVar108 * fVar144 + fVar109 * fVar160;
  fVar255 = fVar90 * (float)(auVar214._12_4_ >> 0x18) +
            fVar108 * (float)(auVar216._12_4_ >> 0x18) + fVar109 * (float)(auVar55._12_4_ >> 0x18);
  fVar235 = fVar90 * fVar51 + fVar108 * fVar161 + fVar109 * fVar212;
  fVar242 = fVar90 * fVar88 + fVar108 * fVar168 + fVar109 * fVar223;
  fVar243 = fVar90 * fVar89 + fVar108 * fVar169 + fVar109 * fVar224;
  fVar244 = fVar90 * (float)(auVar58._12_4_ >> 0x18) +
            fVar108 * (float)(auVar163._12_4_ >> 0x18) + fVar109 * (float)(auVar172._12_4_ >> 0x18);
  fVar170 = fVar90 * fVar197 + fVar108 * fVar225 + fVar109 * fVar257;
  fVar195 = fVar90 * fVar210 + fVar108 * fVar231 + fVar109 * fVar260;
  fVar196 = fVar90 * fVar211 + fVar108 * fVar232 + fVar109 * fVar261;
  fVar90 = fVar90 * (float)(auVar175._12_4_ >> 0x18) +
           fVar108 * (float)(auVar178._12_4_ >> 0x18) + fVar109 * (float)(auVar181._12_4_ >> 0x18);
  fVar111 = fVar110 * fVar123 + fVar130 * fVar128 + fVar145 * fVar129;
  fVar159 = fVar120 * fVar123 + fVar143 * fVar128 + fVar159 * fVar129;
  fVar160 = fVar121 * fVar123 + fVar144 * fVar128 + fVar160 * fVar129;
  fVar122 = (float)(auVar214._12_4_ >> 0x18) * fVar123 +
            (float)(auVar216._12_4_ >> 0x18) * fVar128 + (float)(auVar55._12_4_ >> 0x18) * fVar129;
  fVar161 = fVar51 * fVar123 + fVar161 * fVar128 + fVar212 * fVar129;
  fVar168 = fVar88 * fVar123 + fVar168 * fVar128 + fVar223 * fVar129;
  fVar169 = fVar89 * fVar123 + fVar169 * fVar128 + fVar224 * fVar129;
  fVar212 = (float)(auVar58._12_4_ >> 0x18) * fVar123 +
            (float)(auVar163._12_4_ >> 0x18) * fVar128 + (float)(auVar172._12_4_ >> 0x18) * fVar129;
  fVar130 = fVar123 * fVar197 + fVar128 * fVar225 + fVar129 * fVar257;
  fVar143 = fVar123 * fVar210 + fVar128 * fVar231 + fVar129 * fVar260;
  fVar144 = fVar123 * fVar211 + fVar128 * fVar232 + fVar129 * fVar261;
  fVar145 = fVar123 * (float)(auVar175._12_4_ >> 0x18) +
            fVar128 * (float)(auVar178._12_4_ >> 0x18) + fVar129 * (float)(auVar181._12_4_ >> 0x18);
  fVar109 = (float)DAT_01f80d30;
  fVar51 = DAT_01f80d30._4_4_;
  fVar88 = DAT_01f80d30._8_4_;
  fVar89 = DAT_01f80d30._12_4_;
  uVar44 = -(uint)(fVar109 <= ABS(fVar245));
  uVar46 = -(uint)(fVar51 <= ABS(fVar251));
  uVar48 = -(uint)(fVar88 <= ABS(fVar253));
  uVar49 = -(uint)(fVar89 <= ABS(fVar255));
  auVar248._0_4_ = (uint)fVar245 & uVar44;
  auVar248._4_4_ = (uint)fVar251 & uVar46;
  auVar248._8_4_ = (uint)fVar253 & uVar48;
  auVar248._12_4_ = (uint)fVar255 & uVar49;
  auVar124._0_4_ = ~uVar44 & (uint)fVar109;
  auVar124._4_4_ = ~uVar46 & (uint)fVar51;
  auVar124._8_4_ = ~uVar48 & (uint)fVar88;
  auVar124._12_4_ = ~uVar49 & (uint)fVar89;
  auVar124 = auVar124 | auVar248;
  uVar44 = -(uint)(fVar109 <= ABS(fVar235));
  uVar46 = -(uint)(fVar51 <= ABS(fVar242));
  uVar48 = -(uint)(fVar88 <= ABS(fVar243));
  uVar49 = -(uint)(fVar89 <= ABS(fVar244));
  auVar236._0_4_ = (uint)fVar235 & uVar44;
  auVar236._4_4_ = (uint)fVar242 & uVar46;
  auVar236._8_4_ = (uint)fVar243 & uVar48;
  auVar236._12_4_ = (uint)fVar244 & uVar49;
  auVar131._0_4_ = ~uVar44 & (uint)fVar109;
  auVar131._4_4_ = ~uVar46 & (uint)fVar51;
  auVar131._8_4_ = ~uVar48 & (uint)fVar88;
  auVar131._12_4_ = ~uVar49 & (uint)fVar89;
  auVar131 = auVar131 | auVar236;
  uVar44 = -(uint)(fVar109 <= ABS(fVar170));
  uVar46 = -(uint)(fVar51 <= ABS(fVar195));
  uVar48 = -(uint)(fVar88 <= ABS(fVar196));
  uVar49 = -(uint)(fVar89 <= ABS(fVar90));
  auVar183._0_4_ = (uint)fVar170 & uVar44;
  auVar183._4_4_ = (uint)fVar195 & uVar46;
  auVar183._8_4_ = (uint)fVar196 & uVar48;
  auVar183._12_4_ = (uint)fVar90 & uVar49;
  auVar165._0_4_ = ~uVar44 & (uint)fVar109;
  auVar165._4_4_ = ~uVar46 & (uint)fVar51;
  auVar165._8_4_ = ~uVar48 & (uint)fVar88;
  auVar165._12_4_ = ~uVar49 & (uint)fVar89;
  auVar165 = auVar165 | auVar183;
  auVar60 = rcpps(_DAT_01f80d30,auVar124);
  fVar109 = auVar60._0_4_;
  fVar89 = auVar60._4_4_;
  fVar110 = auVar60._8_4_;
  fVar123 = auVar60._12_4_;
  fVar109 = (1.0 - auVar124._0_4_ * fVar109) * fVar109 + fVar109;
  fVar89 = (1.0 - auVar124._4_4_ * fVar89) * fVar89 + fVar89;
  fVar110 = (1.0 - auVar124._8_4_ * fVar110) * fVar110 + fVar110;
  fVar123 = (1.0 - auVar124._12_4_ * fVar123) * fVar123 + fVar123;
  auVar60 = rcpps(auVar60,auVar131);
  fVar51 = auVar60._0_4_;
  fVar90 = auVar60._4_4_;
  fVar120 = auVar60._8_4_;
  fVar128 = auVar60._12_4_;
  fVar51 = (1.0 - auVar131._0_4_ * fVar51) * fVar51 + fVar51;
  fVar90 = (1.0 - auVar131._4_4_ * fVar90) * fVar90 + fVar90;
  fVar120 = (1.0 - auVar131._8_4_ * fVar120) * fVar120 + fVar120;
  fVar128 = (1.0 - auVar131._12_4_ * fVar128) * fVar128 + fVar128;
  auVar60 = rcpps(auVar60,auVar165);
  fVar88 = auVar60._0_4_;
  fVar108 = auVar60._4_4_;
  fVar121 = auVar60._8_4_;
  fVar129 = auVar60._12_4_;
  fVar88 = (1.0 - auVar165._0_4_ * fVar88) * fVar88 + fVar88;
  fVar108 = (1.0 - auVar165._4_4_ * fVar108) * fVar108 + fVar108;
  fVar121 = (1.0 - auVar165._8_4_ * fVar121) * fVar121 + fVar121;
  fVar129 = (1.0 - auVar165._12_4_ * fVar129) * fVar129 + fVar129;
  uVar43 = *(ulong *)(prim + uVar41 * 7 + 6);
  uVar87 = (undefined2)(uVar43 >> 0x30);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar43;
  auVar63._12_2_ = uVar87;
  auVar63._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar43 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar43;
  auVar62._10_2_ = uVar87;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar87;
  auVar61._0_8_ = uVar43;
  uVar87 = (undefined2)(uVar43 >> 0x10);
  auVar30._4_8_ = auVar61._8_8_;
  auVar30._2_2_ = uVar87;
  auVar30._0_2_ = uVar87;
  auVar125._0_8_ =
       CONCAT44(((float)(auVar30._0_4_ >> 0x10) - fVar159) * fVar89,
                ((float)(int)(short)uVar43 - fVar111) * fVar109);
  auVar125._8_4_ = ((float)(auVar61._8_4_ >> 0x10) - fVar160) * fVar110;
  auVar125._12_4_ = ((float)(auVar62._12_4_ >> 0x10) - fVar122) * fVar123;
  uVar43 = *(ulong *)(prim + uVar41 * 9 + 6);
  uVar87 = (undefined2)(uVar43 >> 0x30);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar43;
  auVar66._12_2_ = uVar87;
  auVar66._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar43 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar43;
  auVar65._10_2_ = uVar87;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar87;
  auVar64._0_8_ = uVar43;
  uVar87 = (undefined2)(uVar43 >> 0x10);
  auVar31._4_8_ = auVar64._8_8_;
  auVar31._2_2_ = uVar87;
  auVar31._0_2_ = uVar87;
  auVar166._0_4_ = ((float)(int)(short)uVar43 - fVar111) * fVar109;
  auVar166._4_4_ = ((float)(auVar31._0_4_ >> 0x10) - fVar159) * fVar89;
  auVar166._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar160) * fVar110;
  auVar166._12_4_ = ((float)(auVar65._12_4_ >> 0x10) - fVar122) * fVar123;
  lVar37 = uVar39 + uVar41;
  uVar43 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  uVar39 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar41 * -2 + 6);
  uVar87 = (undefined2)(uVar39 >> 0x30);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar39;
  auVar186._12_2_ = uVar87;
  auVar186._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar39 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar39;
  auVar185._10_2_ = uVar87;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar87;
  auVar184._0_8_ = uVar39;
  uVar87 = (undefined2)(uVar39 >> 0x10);
  auVar32._4_8_ = auVar184._8_8_;
  auVar32._2_2_ = uVar87;
  auVar32._0_2_ = uVar87;
  auVar187._0_8_ =
       CONCAT44(((float)(auVar32._0_4_ >> 0x10) - fVar168) * fVar90,
                ((float)(int)(short)uVar39 - fVar161) * fVar51);
  auVar187._8_4_ = ((float)(auVar184._8_4_ >> 0x10) - fVar169) * fVar120;
  auVar187._12_4_ = ((float)(auVar185._12_4_ >> 0x10) - fVar212) * fVar128;
  uVar87 = (undefined2)(uVar43 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar43;
  auVar69._12_2_ = uVar87;
  auVar69._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar43 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar43;
  auVar68._10_2_ = uVar87;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar87;
  auVar67._0_8_ = uVar43;
  uVar87 = (undefined2)(uVar43 >> 0x10);
  auVar33._4_8_ = auVar67._8_8_;
  auVar33._2_2_ = uVar87;
  auVar33._0_2_ = uVar87;
  auVar70._0_4_ = ((float)(int)(short)uVar43 - fVar161) * fVar51;
  auVar70._4_4_ = ((float)(auVar33._0_4_ >> 0x10) - fVar168) * fVar90;
  auVar70._8_4_ = ((float)(auVar67._8_4_ >> 0x10) - fVar169) * fVar120;
  auVar70._12_4_ = ((float)(auVar68._12_4_ >> 0x10) - fVar212) * fVar128;
  uVar43 = *(ulong *)(prim + lVar37 + 6);
  uVar87 = (undefined2)(uVar43 >> 0x30);
  auVar148._8_4_ = 0;
  auVar148._0_8_ = uVar43;
  auVar148._12_2_ = uVar87;
  auVar148._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar43 >> 0x20);
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._8_2_ = 0;
  auVar147._0_8_ = uVar43;
  auVar147._10_2_ = uVar87;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._8_2_ = uVar87;
  auVar146._0_8_ = uVar43;
  uVar87 = (undefined2)(uVar43 >> 0x10);
  auVar34._4_8_ = auVar146._8_8_;
  auVar34._2_2_ = uVar87;
  auVar34._0_2_ = uVar87;
  auVar149._0_8_ =
       CONCAT44(((float)(auVar34._0_4_ >> 0x10) - fVar143) * fVar108,
                ((float)(int)(short)uVar43 - fVar130) * fVar88);
  auVar149._8_4_ = ((float)(auVar146._8_4_ >> 0x10) - fVar144) * fVar121;
  auVar149._12_4_ = ((float)(auVar147._12_4_ >> 0x10) - fVar145) * fVar129;
  uVar43 = *(ulong *)(prim + uVar41 * 0x17 + 6);
  uVar87 = (undefined2)(uVar43 >> 0x30);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar43;
  auVar200._12_2_ = uVar87;
  auVar200._14_2_ = uVar87;
  uVar87 = (undefined2)(uVar43 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar43;
  auVar199._10_2_ = uVar87;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar87;
  auVar198._0_8_ = uVar43;
  uVar87 = (undefined2)(uVar43 >> 0x10);
  auVar35._4_8_ = auVar198._8_8_;
  auVar35._2_2_ = uVar87;
  auVar35._0_2_ = uVar87;
  auVar201._0_4_ = ((float)(int)(short)uVar43 - fVar130) * fVar88;
  auVar201._4_4_ = ((float)(auVar35._0_4_ >> 0x10) - fVar143) * fVar108;
  auVar201._8_4_ = ((float)(auVar198._8_4_ >> 0x10) - fVar144) * fVar121;
  auVar201._12_4_ = ((float)(auVar199._12_4_ >> 0x10) - fVar145) * fVar129;
  auVar213._8_4_ = auVar125._8_4_;
  auVar213._0_8_ = auVar125._0_8_;
  auVar213._12_4_ = auVar125._12_4_;
  auVar214 = minps(auVar213,auVar166);
  auVar91._8_4_ = auVar187._8_4_;
  auVar91._0_8_ = auVar187._0_8_;
  auVar91._12_4_ = auVar187._12_4_;
  auVar60 = minps(auVar91,auVar70);
  auVar214 = maxps(auVar214,auVar60);
  auVar92._8_4_ = auVar149._8_4_;
  auVar92._0_8_ = auVar149._0_8_;
  auVar92._12_4_ = auVar149._12_4_;
  auVar60 = minps(auVar92,auVar201);
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar132._4_4_ = uVar4;
  auVar132._0_4_ = uVar4;
  auVar132._8_4_ = uVar4;
  auVar132._12_4_ = uVar4;
  auVar60 = maxps(auVar60,auVar132);
  auVar60 = maxps(auVar214,auVar60);
  local_168 = auVar60._0_4_ * 0.99999964;
  fStack_164 = auVar60._4_4_ * 0.99999964;
  fStack_160 = auVar60._8_4_ * 0.99999964;
  fStack_15c = auVar60._12_4_ * 0.99999964;
  auVar60 = maxps(auVar125,auVar166);
  auVar214 = maxps(auVar187,auVar70);
  auVar60 = minps(auVar60,auVar214);
  auVar214 = maxps(auVar149,auVar201);
  fVar109 = ray->tfar;
  auVar71._4_4_ = fVar109;
  auVar71._0_4_ = fVar109;
  auVar71._8_4_ = fVar109;
  auVar71._12_4_ = fVar109;
  auVar214 = minps(auVar214,auVar71);
  auVar60 = minps(auVar60,auVar214);
  auVar93._0_4_ = -(uint)(PVar3 != (Primitive)0x0 && local_168 <= auVar60._0_4_ * 1.0000004);
  auVar93._4_4_ = -(uint)(1 < (byte)PVar3 && fStack_164 <= auVar60._4_4_ * 1.0000004);
  auVar93._8_4_ = -(uint)(2 < (byte)PVar3 && fStack_160 <= auVar60._8_4_ * 1.0000004);
  auVar93._12_4_ = -(uint)(3 < (byte)PVar3 && fStack_15c <= auVar60._12_4_ * 1.0000004);
  uVar44 = movmskps((int)lVar37,auVar93);
  if (uVar44 == 0) {
    return false;
  }
  uVar44 = uVar44 & 0xff;
  local_158._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_158._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_158._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_158._12_4_ = 0;
LAB_00a8f179:
  uVar43 = (ulong)uVar44;
  lVar37 = 0;
  if (uVar43 != 0) {
    for (; (uVar44 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
    }
  }
  local_3c0 = (ulong)*(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  uVar39 = *(ulong *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  local_280 = (ulong)*(uint *)(prim + lVar37 * 4 + 6);
  uVar41 = (ulong)*(uint *)(uVar39 + _Var6 * *(uint *)(prim + lVar37 * 4 + 6));
  p_Var7 = pGVar5[1].intersectionFilterN;
  pvVar8 = pGVar5[2].userPtr;
  _Var9 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar2 = (float *)(_Var9 + uVar41 * (long)pvVar8);
  fVar109 = *pfVar2;
  fVar51 = pfVar2[1];
  fVar88 = pfVar2[2];
  fVar89 = pfVar2[3];
  pfVar2 = (float *)(_Var9 + (uVar41 + 1) * (long)pvVar8);
  fVar90 = *pfVar2;
  fVar108 = pfVar2[1];
  fVar110 = pfVar2[2];
  fVar120 = pfVar2[3];
  pfVar2 = (float *)(_Var9 + (uVar41 + 2) * (long)pvVar8);
  fVar121 = *pfVar2;
  fVar123 = pfVar2[1];
  fVar128 = pfVar2[2];
  fVar129 = pfVar2[3];
  pfVar2 = (float *)(_Var9 + (long)pvVar8 * (uVar41 + 3));
  fVar130 = *pfVar2;
  fVar143 = pfVar2[1];
  fVar144 = pfVar2[2];
  fVar145 = pfVar2[3];
  uVar43 = uVar43 - 1 & uVar43;
  lVar37 = *(long *)&pGVar5[1].time_range.upper;
  pfVar2 = (float *)(lVar37 + (long)p_Var7 * uVar41);
  fVar111 = *pfVar2;
  fVar159 = pfVar2[1];
  fVar160 = pfVar2[2];
  fVar122 = pfVar2[3];
  pfVar2 = (float *)(lVar37 + (long)p_Var7 * (uVar41 + 1));
  fVar161 = *pfVar2;
  fVar168 = pfVar2[1];
  fVar169 = pfVar2[2];
  fVar170 = pfVar2[3];
  pfVar2 = (float *)(lVar37 + (long)p_Var7 * (uVar41 + 2));
  fVar195 = *pfVar2;
  fVar196 = pfVar2[1];
  fVar197 = pfVar2[2];
  fVar210 = pfVar2[3];
  lVar10 = 0;
  if (uVar43 != 0) {
    for (; (uVar43 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  pfVar2 = (float *)(lVar37 + (long)p_Var7 * (uVar41 + 3));
  fVar211 = *pfVar2;
  fVar212 = pfVar2[1];
  fVar223 = pfVar2[2];
  fVar224 = pfVar2[3];
  if ((uVar43 != 0) && (uVar41 = uVar43 - 1 & uVar43, uVar41 != 0)) {
    lVar37 = 0;
    if (uVar41 != 0) {
      for (; (uVar41 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
      }
    }
    uVar39 = (ulong)*(uint *)(uVar39 + _Var6 * *(uint *)(prim + lVar37 * 4 + 6));
  }
  fVar225 = fVar195 * 0.0 + fVar211 * -0.0 + fVar161 + fVar111 * -0.0;
  fVar231 = fVar196 * 0.0 + fVar212 * -0.0 + fVar168 + fVar159 * -0.0;
  fVar232 = fVar197 * 0.0 + fVar223 * -0.0 + fVar169 + fVar160 * -0.0;
  fVar235 = fVar210 * 0.0 + fVar224 * -0.0 + fVar170 + fVar122 * -0.0;
  fVar242 = (fVar195 * 0.5 + fVar211 * 0.0 + fVar161 * 0.0) - fVar111 * 0.5;
  fVar243 = (fVar196 * 0.5 + fVar212 * 0.0 + fVar168 * 0.0) - fVar159 * 0.5;
  fVar244 = (fVar197 * 0.5 + fVar223 * 0.0 + fVar169 * 0.0) - fVar160 * 0.5;
  fVar245 = (fVar210 * 0.5 + fVar224 * 0.0 + fVar170 * 0.0) - fVar122 * 0.5;
  fVar246 = (fVar121 * 0.5 + fVar130 * 0.0 + fVar90 * 0.0) - fVar109 * 0.5;
  fVar252 = (fVar123 * 0.5 + fVar143 * 0.0 + fVar108 * 0.0) - fVar51 * 0.5;
  fVar254 = (fVar128 * 0.5 + fVar144 * 0.0 + fVar110 * 0.0) - fVar88 * 0.5;
  fVar256 = (fVar129 * 0.5 + fVar145 * 0.0 + fVar120 * 0.0) - fVar89 * 0.5;
  fVar260 = fVar121 * 0.0 + fVar130 * -0.0 + fVar90 + fVar109 * -0.0;
  fVar261 = fVar123 * 0.0 + fVar143 * -0.0 + fVar108 + fVar51 * -0.0;
  fVar233 = fVar128 * 0.0 + fVar144 * -0.0 + fVar110 + fVar88 * -0.0;
  fVar234 = fVar129 * 0.0 + fVar145 * -0.0 + fVar120 + fVar89 * -0.0;
  fVar251 = fVar211 * -0.0 + fVar195 + fVar161 * 0.0 + fVar111 * -0.0;
  fVar253 = fVar212 * -0.0 + fVar196 + fVar168 * 0.0 + fVar159 * -0.0;
  fVar255 = fVar223 * -0.0 + fVar197 + fVar169 * 0.0 + fVar160 * -0.0;
  fVar257 = fVar224 * -0.0 + fVar210 + fVar170 * 0.0 + fVar122 * -0.0;
  fVar111 = fVar111 * 0.0 + ((fVar211 * 0.5 + fVar195 * 0.0) - fVar161 * 0.5);
  fVar159 = fVar159 * 0.0 + ((fVar212 * 0.5 + fVar196 * 0.0) - fVar168 * 0.5);
  fVar160 = fVar160 * 0.0 + ((fVar223 * 0.5 + fVar197 * 0.0) - fVar169 * 0.5);
  fVar122 = fVar122 * 0.0 + ((fVar224 * 0.5 + fVar210 * 0.0) - fVar170 * 0.5);
  fVar161 = fVar130 * -0.0 + fVar121 + fVar90 * 0.0 + fVar109 * -0.0;
  fVar168 = fVar143 * -0.0 + fVar123 + fVar108 * 0.0 + fVar51 * -0.0;
  fVar169 = fVar144 * -0.0 + fVar128 + fVar110 * 0.0 + fVar88 * -0.0;
  fVar170 = fVar145 * -0.0 + fVar129 + fVar120 * 0.0 + fVar89 * -0.0;
  fVar109 = fVar109 * 0.0 + ((fVar130 * 0.5 + fVar121 * 0.0) - fVar90 * 0.5);
  fVar51 = fVar51 * 0.0 + ((fVar143 * 0.5 + fVar123 * 0.0) - fVar108 * 0.5);
  fVar88 = fVar88 * 0.0 + ((fVar144 * 0.5 + fVar128 * 0.0) - fVar110 * 0.5);
  fVar89 = fVar89 * 0.0 + ((fVar145 * 0.5 + fVar129 * 0.0) - fVar120 * 0.5);
  fVar195 = fVar243 * fVar260 - fVar261 * fVar242;
  fVar197 = fVar244 * fVar261 - fVar233 * fVar243;
  fVar210 = fVar242 * fVar233 - fVar260 * fVar244;
  fVar211 = fVar245 * fVar234 - fVar234 * fVar245;
  fVar130 = fVar243 * fVar246 - fVar252 * fVar242;
  fVar144 = fVar244 * fVar252 - fVar254 * fVar243;
  fVar145 = fVar242 * fVar254 - fVar246 * fVar244;
  fVar120 = fVar159 * fVar161 - fVar168 * fVar111;
  fVar123 = fVar160 * fVar168 - fVar169 * fVar159;
  fVar128 = fVar111 * fVar169 - fVar161 * fVar160;
  fVar129 = fVar122 * fVar170 - fVar170 * fVar122;
  fVar90 = fVar159 * fVar109 - fVar51 * fVar111;
  fVar51 = fVar160 * fVar51 - fVar88 * fVar159;
  fVar88 = fVar111 * fVar88 - fVar109 * fVar160;
  fVar168 = fVar210 * fVar210 + fVar197 * fVar197 + fVar195 * fVar195;
  auVar214 = ZEXT416((uint)fVar168);
  auVar60 = rsqrtss(ZEXT416((uint)fVar168),auVar214);
  fVar109 = auVar60._0_4_;
  fVar169 = fVar109 * 1.5 - fVar109 * fVar109 * fVar168 * 0.5 * fVar109;
  fVar196 = fVar195 * fVar130 + fVar210 * fVar145 + fVar197 * fVar144;
  fVar109 = fVar211 * fVar169;
  auVar60 = rcpss(auVar214,auVar214);
  fVar143 = (2.0 - fVar168 * auVar60._0_4_) * auVar60._0_4_;
  fVar161 = fVar128 * fVar128 + fVar123 * fVar123 + fVar120 * fVar120;
  auVar60 = ZEXT416((uint)fVar161);
  auVar214 = rsqrtss(ZEXT416((uint)fVar161),auVar60);
  fVar108 = auVar214._0_4_;
  fVar121 = fVar108 * 1.5 - fVar108 * fVar108 * fVar161 * 0.5 * fVar108;
  fVar170 = fVar120 * fVar90 + fVar128 * fVar88 + fVar123 * fVar51;
  fVar110 = fVar129 * fVar121;
  auVar60 = rcpss(auVar60,auVar60);
  fVar108 = (2.0 - fVar161 * auVar60._0_4_) * auVar60._0_4_;
  local_348 = fVar235 * fVar197 * fVar169;
  fStack_344 = fVar235 * fVar210 * fVar169;
  fStack_340 = fVar235 * fVar195 * fVar169;
  fStack_33c = fVar235 * fVar109;
  local_358 = fVar225 - local_348;
  fStack_354 = fVar231 - fStack_344;
  fStack_350 = fVar232 - fStack_340;
  fStack_34c = fVar235 - fStack_33c;
  fVar144 = fVar235 * fVar143 * (fVar168 * fVar144 - fVar196 * fVar197) * fVar169 +
            fVar245 * fVar197 * fVar169;
  fVar145 = fVar235 * fVar143 * (fVar168 * fVar145 - fVar196 * fVar210) * fVar169 +
            fVar245 * fVar210 * fVar169;
  fVar130 = fVar235 * fVar143 * (fVar168 * fVar130 - fVar196 * fVar195) * fVar169 +
            fVar245 * fVar195 * fVar169;
  fVar143 = fVar235 * fVar143 * (fVar168 * (fVar245 * fVar256 - fVar256 * fVar245) -
                                fVar196 * fVar211) * fVar169 + fVar245 * fVar109;
  local_348 = local_348 + fVar225;
  fStack_344 = fStack_344 + fVar231;
  fStack_340 = fStack_340 + fVar232;
  fStack_33c = fStack_33c + fVar235;
  local_3b8 = fVar257 * fVar123 * fVar121;
  fStack_3b4 = fVar257 * fVar128 * fVar121;
  fStack_3b0 = fVar257 * fVar120 * fVar121;
  fStack_3ac = fVar257 * fVar110;
  local_378 = fVar251 - local_3b8;
  fStack_374 = fVar253 - fStack_3b4;
  fStack_370 = fVar255 - fStack_3b0;
  fStack_36c = fVar257 - fStack_3ac;
  fVar109 = fVar257 * fVar108 * (fVar161 * fVar51 - fVar170 * fVar123) * fVar121 +
            fVar122 * fVar123 * fVar121;
  fVar51 = fVar257 * fVar108 * (fVar161 * fVar88 - fVar170 * fVar128) * fVar121 +
           fVar122 * fVar128 * fVar121;
  fVar88 = fVar257 * fVar108 * (fVar161 * fVar90 - fVar170 * fVar120) * fVar121 +
           fVar122 * fVar120 * fVar121;
  fVar89 = fVar257 * fVar108 * (fVar161 * (fVar122 * fVar89 - fVar89 * fVar122) - fVar170 * fVar129)
                     * fVar121 + fVar122 * fVar110;
  local_3b8 = local_3b8 + fVar251;
  fStack_3b4 = fStack_3b4 + fVar253;
  fStack_3b0 = fStack_3b0 + fVar255;
  fStack_3ac = fStack_3ac + fVar257;
  local_368 = (fVar242 - fVar144) * 0.33333334 + local_358;
  fStack_364 = (fVar243 - fVar145) * 0.33333334 + fStack_354;
  fStack_360 = (fVar244 - fVar130) * 0.33333334 + fStack_350;
  fStack_35c = (fVar245 - fVar143) * 0.33333334 + fStack_34c;
  local_388 = local_378 - (fVar111 - fVar109) * 0.33333334;
  fStack_384 = fStack_374 - (fVar159 - fVar51) * 0.33333334;
  fStack_380 = fStack_370 - (fVar160 - fVar88) * 0.33333334;
  fStack_37c = fStack_36c - (fVar122 - fVar89) * 0.33333334;
  local_398 = local_3b8 - (fVar109 + fVar111) * 0.33333334;
  fStack_394 = fStack_3b4 - (fVar51 + fVar159) * 0.33333334;
  fStack_390 = fStack_3b0 - (fVar88 + fVar160) * 0.33333334;
  fStack_38c = fStack_3ac - (fVar89 + fVar122) * 0.33333334;
  fVar109 = (ray->org).field_0.m128[0];
  fVar51 = (ray->org).field_0.m128[1];
  fVar88 = (ray->org).field_0.m128[2];
  fVar89 = (pre->ray_space).vx.field_0.m128[0];
  fVar90 = (pre->ray_space).vx.field_0.m128[1];
  fVar108 = (pre->ray_space).vy.field_0.m128[0];
  fVar110 = (pre->ray_space).vy.field_0.m128[1];
  fVar120 = (pre->ray_space).vz.field_0.m128[0];
  fVar121 = (pre->ray_space).vz.field_0.m128[1];
  fVar160 = (local_358 - fVar109) * fVar89 +
            (fStack_354 - fVar51) * fVar108 + (fStack_350 - fVar88) * fVar120;
  fVar122 = (local_358 - fVar109) * fVar90 +
            (fStack_354 - fVar51) * fVar110 + (fStack_350 - fVar88) * fVar121;
  local_2c8 = CONCAT44(fVar122,fVar160);
  fVar111 = (local_368 - fVar109) * fVar89 +
            (fStack_364 - fVar51) * fVar108 + (fStack_360 - fVar88) * fVar120;
  fVar159 = (local_368 - fVar109) * fVar90 +
            (fStack_364 - fVar51) * fVar110 + (fStack_360 - fVar88) * fVar121;
  uVar247 = CONCAT44(fVar159,fVar111);
  local_2e8 = (local_388 - fVar109) * fVar89 +
              (fStack_384 - fVar51) * fVar108 + (fStack_380 - fVar88) * fVar120;
  fStack_2e4 = (local_388 - fVar109) * fVar90 +
               (fStack_384 - fVar51) * fVar110 + (fStack_380 - fVar88) * fVar121;
  auVar94._0_8_ = CONCAT44(fStack_2e4,local_2e8);
  fVar123 = (local_378 - fVar109) * fVar89 +
            (fStack_374 - fVar51) * fVar108 + (fStack_370 - fVar88) * fVar120;
  fVar128 = (local_378 - fVar109) * fVar90 +
            (fStack_374 - fVar51) * fVar110 + (fStack_370 - fVar88) * fVar121;
  uVar52 = CONCAT44(fVar128,fVar123);
  afStack_1e8[0] =
       (local_348 - fVar109) * fVar89 +
       (fStack_344 - fVar51) * fVar108 + (fStack_340 - fVar88) * fVar120;
  afStack_1e8[1] =
       (local_348 - fVar109) * fVar90 +
       (fStack_344 - fVar51) * fVar110 + (fStack_340 - fVar88) * fVar121;
  local_208 = (fVar144 + fVar242) * 0.33333334 + local_348;
  fStack_204 = (fVar145 + fVar243) * 0.33333334 + fStack_344;
  fStack_200 = (fVar130 + fVar244) * 0.33333334 + fStack_340;
  fStack_1fc = (fVar143 + fVar245) * 0.33333334 + fStack_33c;
  fVar129 = (local_208 - fVar109) * fVar89 +
            (fStack_204 - fVar51) * fVar108 + (fStack_200 - fVar88) * fVar120;
  fVar130 = (local_208 - fVar109) * fVar90 +
            (fStack_204 - fVar51) * fVar110 + (fStack_200 - fVar88) * fVar121;
  uStack_2a0 = CONCAT44(fVar130,fVar129);
  local_2a8 = (local_398 - fVar109) * fVar89 +
              (fStack_394 - fVar51) * fVar108 + (fStack_390 - fVar88) * fVar120;
  fStack_2a4 = (local_398 - fVar109) * fVar90 +
               (fStack_394 - fVar51) * fVar110 + (fStack_390 - fVar88) * fVar121;
  fVar89 = (local_3b8 - fVar109) * fVar89 +
           (fStack_3b4 - fVar51) * fVar108 + (fStack_3b0 - fVar88) * fVar120;
  fVar109 = (local_3b8 - fVar109) * fVar90 +
            (fStack_3b4 - fVar51) * fVar110 + (fStack_3b0 - fVar88) * fVar121;
  local_338 = CONCAT44(fVar109,fVar89);
  auVar237._8_8_ = uStack_2a0;
  auVar237._0_8_ = uVar247;
  register0x00001588 = local_338;
  local_3d8 = uVar52;
  auVar72._8_4_ = afStack_1e8[0];
  auVar72._0_8_ = local_2c8;
  auVar72._12_4_ = afStack_1e8[1];
  auVar60 = minps(auVar72,auVar237);
  auVar94._8_4_ = local_2a8;
  auVar94._12_4_ = fStack_2a4;
  auVar214 = minps(auVar94,_local_3d8);
  auVar60 = minps(auVar60,auVar214);
  auVar95._4_4_ = fVar122;
  auVar95._0_4_ = fVar160;
  auVar95._8_4_ = afStack_1e8[0];
  auVar95._12_4_ = afStack_1e8[1];
  auVar214 = maxps(auVar95,auVar237);
  auVar112._4_4_ = fStack_2e4;
  auVar112._0_4_ = local_2e8;
  auVar112._8_4_ = local_2a8;
  auVar112._12_4_ = fStack_2a4;
  auVar113 = maxps(auVar112,_local_3d8);
  auVar96 = maxps(auVar214,auVar113);
  auVar12._4_8_ = auVar113._8_8_;
  auVar12._0_4_ = auVar60._4_4_;
  auVar114._0_8_ = auVar12._0_8_ << 0x20;
  auVar114._8_4_ = auVar60._8_4_;
  auVar114._12_4_ = auVar60._12_4_;
  auVar115._8_8_ = auVar60._8_8_;
  auVar115._0_8_ = auVar114._8_8_;
  auVar214 = minps(auVar60,auVar115);
  auVar13._4_8_ = auVar60._8_8_;
  auVar13._0_4_ = auVar96._4_4_;
  auVar116._0_8_ = auVar13._0_8_ << 0x20;
  auVar116._8_4_ = auVar96._8_4_;
  auVar116._12_4_ = auVar96._12_4_;
  auVar117._8_8_ = auVar96._8_8_;
  auVar117._0_8_ = auVar116._8_8_;
  auVar60 = maxps(auVar96,auVar117);
  auVar73._0_8_ = auVar214._0_8_ & 0x7fffffff7fffffff;
  auVar73._8_4_ = auVar214._8_4_ & 0x7fffffff;
  auVar73._12_4_ = auVar214._12_4_ & 0x7fffffff;
  auVar97._0_8_ = auVar60._0_8_ & 0x7fffffff7fffffff;
  auVar97._8_4_ = auVar60._8_4_ & 0x7fffffff;
  auVar97._12_4_ = auVar60._12_4_ & 0x7fffffff;
  auVar60 = maxps(auVar73,auVar97);
  fStack_294 = auVar60._4_4_;
  local_298 = fStack_294;
  if (fStack_294 <= auVar60._0_4_) {
    local_298 = auVar60._0_4_;
  }
  local_298 = local_298 * 9.536743e-07;
  register0x000015c8 = local_2c8;
  register0x00001408 = uVar247;
  local_2d8 = uVar247;
  register0x00001548 = uVar52;
  local_2f8 = uVar52;
  register0x00001288 = uStack_2a0;
  local_318 = uStack_2a0;
  register0x00001348 = local_338;
  fStack_290 = fStack_294;
  fStack_28c = fStack_294;
  local_138 = local_298;
  fStack_134 = local_298;
  fStack_130 = local_298;
  fStack_12c = local_298;
  local_1f8 = local_2c8;
  local_88 = fVar111 - fVar160;
  fStack_84 = fVar159 - fVar122;
  fStack_80 = fVar129 - afStack_1e8[0];
  fStack_7c = fVar130 - afStack_1e8[1];
  local_98 = local_2e8 - fVar111;
  fStack_94 = fStack_2e4 - fVar159;
  fStack_90 = local_2a8 - fVar129;
  fStack_8c = fStack_2a4 - fVar130;
  local_2b8 = auVar94._0_8_;
  local_a8 = fVar123 - local_2e8;
  fStack_a4 = fVar128 - fStack_2e4;
  fStack_a0 = fVar89 - local_2a8;
  fStack_9c = fVar109 - fStack_2a4;
  local_178 = local_348 - local_358;
  fStack_174 = fStack_344 - fStack_354;
  fStack_170 = fStack_340 - fStack_350;
  fStack_16c = fStack_33c - fStack_34c;
  local_188 = local_208 - local_368;
  fStack_184 = fStack_204 - fStack_364;
  fStack_180 = fStack_200 - fStack_360;
  fStack_17c = fStack_1fc - fStack_35c;
  local_198 = local_398 - local_388;
  fStack_194 = fStack_394 - fStack_384;
  fStack_190 = fStack_390 - fStack_380;
  fStack_18c = fStack_38c - fStack_37c;
  local_1a8 = local_3b8 - local_378;
  fStack_1a4 = fStack_3b4 - fStack_374;
  fStack_1a0 = fStack_3b0 - fStack_370;
  fStack_19c = fStack_3ac - fStack_36c;
  bVar36 = false;
  uVar41 = 0;
  local_3e8 = 0.0;
  fStack_3e4 = 1.0;
  fStack_3e0 = 0.0;
  fStack_3dc = 0.0;
  fVar109 = 0.0;
  fVar51 = 1.0;
  local_148 = -local_298;
  fStack_144 = -local_298;
  fStack_140 = -local_298;
  fStack_13c = -local_298;
  fStack_2e0 = local_2e8;
  fStack_2dc = fStack_2e4;
  local_308 = afStack_1e8[0];
  fStack_304 = afStack_1e8[1];
  fStack_300 = afStack_1e8[0];
  fStack_2fc = afStack_1e8[1];
  local_328 = local_2a8;
  fStack_324 = fStack_2a4;
  fStack_320 = local_2a8;
  fStack_31c = fStack_2a4;
LAB_00a8f9f0:
  do {
    fVar88 = 1.0 - fVar109;
    fVar89 = 1.0 - fVar109;
    fVar90 = 1.0 - fVar51;
    fVar108 = 1.0 - fVar51;
    fVar160 = local_2c8._0_4_ * fVar88 + local_308 * fVar109;
    fVar195 = local_2c8._4_4_ * fVar89 + fStack_304 * fVar109;
    fVar196 = local_2c8._8_4_ * fVar90 + fStack_300 * fVar51;
    fVar197 = local_2c8._12_4_ * fVar108 + fStack_2fc * fVar51;
    fVar123 = local_2d8._0_4_ * fVar88 + local_318._0_4_ * fVar109;
    fVar168 = local_2d8._4_4_ * fVar89 + local_318._4_4_ * fVar109;
    fVar169 = local_2d8._8_4_ * fVar90 + local_318._8_4_ * fVar51;
    fVar170 = local_2d8._12_4_ * fVar108 + local_318._12_4_ * fVar51;
    fVar212 = local_2e8 * fVar88 + local_328 * fVar109;
    fVar223 = fStack_2e4 * fVar89 + fStack_324 * fVar109;
    fVar245 = fStack_2e0 * fVar90 + fStack_320 * fVar51;
    fVar251 = fStack_2dc * fVar108 + fStack_31c * fVar51;
    fVar210 = fVar88 * local_2f8._0_4_ + fVar109 * local_338._0_4_;
    fVar211 = fVar89 * local_2f8._4_4_ + fVar109 * local_338._4_4_;
    fVar225 = fVar90 * local_2f8._8_4_ + fVar51 * local_338._8_4_;
    fVar231 = fVar108 * local_2f8._12_4_ + fVar51 * local_338._12_4_;
    fVar232 = (fStack_3e4 - local_3e8) * 0.11111111;
    fVar235 = (fStack_3e4 - local_3e8) * 0.0 + local_3e8;
    fVar242 = (fStack_3e4 - local_3e8) * 0.33333334 + local_3e8;
    fVar243 = (fStack_3e4 - local_3e8) * 0.6666667 + local_3e8;
    fVar244 = (fStack_3e4 - local_3e8) * 1.0 + local_3e8;
    fVar89 = 1.0 - fVar235;
    fVar108 = 1.0 - fVar242;
    fVar110 = 1.0 - fVar243;
    fVar120 = 1.0 - fVar244;
    fVar128 = fVar123 * fVar89 + fVar212 * fVar235;
    fVar129 = fVar123 * fVar108 + fVar212 * fVar242;
    fVar130 = fVar123 * fVar110 + fVar212 * fVar243;
    fVar143 = fVar123 * fVar120 + fVar212 * fVar244;
    fVar144 = fVar168 * fVar89 + fVar223 * fVar235;
    fVar145 = fVar168 * fVar108 + fVar223 * fVar242;
    fVar111 = fVar168 * fVar110 + fVar223 * fVar243;
    fVar159 = fVar168 * fVar120 + fVar223 * fVar244;
    fVar88 = (fVar160 * fVar89 + fVar123 * fVar235) * fVar89 + fVar235 * fVar128;
    fVar90 = (fVar160 * fVar108 + fVar123 * fVar242) * fVar108 + fVar242 * fVar129;
    fVar121 = (fVar160 * fVar110 + fVar123 * fVar243) * fVar110 + fVar243 * fVar130;
    fVar123 = (fVar160 * fVar120 + fVar123 * fVar244) * fVar120 + fVar244 * fVar143;
    fVar160 = (fVar195 * fVar89 + fVar168 * fVar235) * fVar89 + fVar235 * fVar144;
    fVar122 = (fVar195 * fVar108 + fVar168 * fVar242) * fVar108 + fVar242 * fVar145;
    fVar161 = (fVar195 * fVar110 + fVar168 * fVar243) * fVar110 + fVar243 * fVar111;
    fVar168 = (fVar195 * fVar120 + fVar168 * fVar244) * fVar120 + fVar244 * fVar159;
    fVar128 = fVar128 * fVar89 + (fVar212 * fVar89 + fVar210 * fVar235) * fVar235;
    fVar129 = fVar129 * fVar108 + (fVar212 * fVar108 + fVar210 * fVar242) * fVar242;
    fVar130 = fVar130 * fVar110 + (fVar212 * fVar110 + fVar210 * fVar243) * fVar243;
    fVar143 = fVar143 * fVar120 + (fVar212 * fVar120 + fVar210 * fVar244) * fVar244;
    fVar144 = fVar144 * fVar89 + (fVar223 * fVar89 + fVar211 * fVar235) * fVar235;
    fVar145 = fVar145 * fVar108 + (fVar223 * fVar108 + fVar211 * fVar242) * fVar242;
    fVar111 = fVar111 * fVar110 + (fVar223 * fVar110 + fVar211 * fVar243) * fVar243;
    fVar159 = fVar159 * fVar120 + (fVar223 * fVar120 + fVar211 * fVar244) * fVar244;
    local_248 = fVar89 * fVar88 + fVar235 * fVar128;
    fStack_244 = fVar108 * fVar90 + fVar242 * fVar129;
    fStack_240 = fVar110 * fVar121 + fVar243 * fVar130;
    fStack_23c = fVar120 * fVar123 + fVar244 * fVar143;
    local_128 = fVar89 * fVar160 + fVar235 * fVar144;
    fStack_124 = fVar108 * fVar122 + fVar242 * fVar145;
    fStack_120 = fVar110 * fVar161 + fVar243 * fVar111;
    fStack_11c = fVar120 * fVar168 + fVar244 * fVar159;
    fVar129 = (fVar129 - fVar90) * 3.0 * fVar232;
    fVar121 = (fVar130 - fVar121) * 3.0 * fVar232;
    fVar123 = (fVar143 - fVar123) * 3.0 * fVar232;
    fVar130 = (fVar145 - fVar122) * 3.0 * fVar232;
    fVar143 = (fVar111 - fVar161) * 3.0 * fVar232;
    fVar145 = (fVar159 - fVar168) * 3.0 * fVar232;
    local_218._4_4_ = fStack_240;
    local_218._0_4_ = fStack_244;
    local_218._8_4_ = fStack_23c;
    local_218._12_4_ = 0;
    local_c8._4_4_ = fStack_120;
    local_c8._0_4_ = fStack_124;
    local_228 = local_248 + (fVar128 - fVar88) * 3.0 * fVar232;
    fStack_224 = fStack_244 + fVar129;
    fStack_220 = fStack_240 + fVar121;
    fStack_21c = fStack_23c + fVar123;
    fVar88 = local_128 + (fVar144 - fVar160) * 3.0 * fVar232;
    fVar90 = fStack_124 + fVar130;
    fStack_3a0 = fStack_120 + fVar143;
    fStack_39c = fStack_11c + fVar145;
    local_3a8 = CONCAT44(fVar90,fVar88);
    local_238._0_4_ = fStack_244 - fVar129;
    local_238._4_4_ = fStack_240 - fVar121;
    local_238._8_4_ = fStack_23c - fVar123;
    local_238._12_4_ = 0;
    local_418._0_4_ = fStack_124 - fVar130;
    local_418._4_4_ = fStack_120 - fVar143;
    fStack_410 = fStack_11c - fVar145;
    fStack_40c = 0.0;
    fVar121 = fVar169 * fVar89 + fVar245 * fVar235;
    fVar123 = fVar169 * fVar108 + fVar245 * fVar242;
    fVar128 = fVar169 * fVar110 + fVar245 * fVar243;
    fVar129 = fVar169 * fVar120 + fVar245 * fVar244;
    fVar130 = fVar170 * fVar89 + fVar251 * fVar235;
    fVar143 = fVar170 * fVar108 + fVar251 * fVar242;
    fVar144 = fVar170 * fVar110 + fVar251 * fVar243;
    fVar145 = fVar170 * fVar120 + fVar251 * fVar244;
    fVar111 = (fVar196 * fVar89 + fVar169 * fVar235) * fVar89 + fVar235 * fVar121;
    fVar159 = (fVar196 * fVar108 + fVar169 * fVar242) * fVar108 + fVar242 * fVar123;
    fVar160 = (fVar196 * fVar110 + fVar169 * fVar243) * fVar110 + fVar243 * fVar128;
    fVar122 = (fVar196 * fVar120 + fVar169 * fVar244) * fVar120 + fVar244 * fVar129;
    fVar211 = (fVar197 * fVar89 + fVar170 * fVar235) * fVar89 + fVar235 * fVar130;
    fVar212 = (fVar197 * fVar108 + fVar170 * fVar242) * fVar108 + fVar242 * fVar143;
    fVar223 = (fVar197 * fVar110 + fVar170 * fVar243) * fVar110 + fVar243 * fVar144;
    fVar224 = (fVar197 * fVar120 + fVar170 * fVar244) * fVar120 + fVar244 * fVar145;
    fVar161 = fVar121 * fVar89 + (fVar245 * fVar89 + fVar225 * fVar235) * fVar235;
    fVar168 = fVar123 * fVar108 + (fVar245 * fVar108 + fVar225 * fVar242) * fVar242;
    fVar169 = fVar128 * fVar110 + (fVar245 * fVar110 + fVar225 * fVar243) * fVar243;
    fVar170 = fVar129 * fVar120 + (fVar245 * fVar120 + fVar225 * fVar244) * fVar244;
    fVar195 = fVar130 * fVar89 + (fVar251 * fVar89 + fVar231 * fVar235) * fVar235;
    fVar196 = fVar143 * fVar108 + (fVar251 * fVar108 + fVar231 * fVar242) * fVar242;
    fVar197 = fVar144 * fVar110 + (fVar251 * fVar110 + fVar231 * fVar243) * fVar243;
    fVar210 = fVar145 * fVar120 + (fVar251 * fVar120 + fVar231 * fVar244) * fVar244;
    fVar130 = fVar89 * fVar111 + fVar235 * fVar161;
    fVar143 = fVar108 * fVar159 + fVar242 * fVar168;
    fVar144 = fVar110 * fVar160 + fVar243 * fVar169;
    fVar145 = fVar120 * fVar122 + fVar244 * fVar170;
    fVar121 = fVar89 * fVar211 + fVar235 * fVar195;
    fVar123 = fVar108 * fVar212 + fVar242 * fVar196;
    fVar128 = fVar110 * fVar223 + fVar243 * fVar197;
    fVar129 = fVar120 * fVar224 + fVar244 * fVar210;
    fVar89 = (fVar168 - fVar159) * 3.0 * fVar232;
    fVar108 = (fVar169 - fVar160) * 3.0 * fVar232;
    fVar110 = (fVar170 - fVar122) * 3.0 * fVar232;
    fVar120 = (fVar196 - fVar212) * 3.0 * fVar232;
    fVar159 = (fVar197 - fVar223) * 3.0 * fVar232;
    fVar160 = (fVar210 - fVar224) * 3.0 * fVar232;
    local_d8._4_4_ = fVar144;
    local_d8._0_4_ = fVar143;
    local_d8._8_4_ = fVar145;
    local_d8._12_4_ = 0;
    local_f8._4_4_ = fVar128;
    local_f8._0_4_ = fVar123;
    local_f8._8_4_ = fVar129;
    local_f8._12_4_ = 0;
    local_118 = fVar130 + (fVar161 - fVar111) * 3.0 * fVar232;
    fStack_114 = fVar143 + fVar89;
    fStack_110 = fVar144 + fVar108;
    fStack_10c = fVar145 + fVar110;
    local_e8 = fVar121 + (fVar195 - fVar211) * 3.0 * fVar232;
    fStack_e4 = fVar123 + fVar120;
    fStack_e0 = fVar128 + fVar159;
    fStack_dc = fVar129 + fVar160;
    local_b8._0_4_ = fVar143 - fVar89;
    local_b8._4_4_ = fVar144 - fVar108;
    local_b8._8_4_ = fVar145 - fVar110;
    local_b8._12_4_ = 0;
    local_108._0_4_ = fVar123 - fVar120;
    local_108._4_4_ = fVar128 - fVar159;
    local_108._8_4_ = fVar129 - fVar160;
    local_108._12_4_ = 0;
    fVar89 = (fVar143 - fStack_244) + (fVar130 - local_248);
    fVar108 = (fVar144 - fStack_240) + (fVar143 - fStack_244);
    fVar110 = (fVar145 - fStack_23c) + (fVar144 - fStack_240);
    fVar120 = (fVar145 - fStack_23c) + 0.0;
    local_c8._8_4_ = fStack_11c;
    local_c8._12_4_ = 0;
    fVar111 = (fVar123 - fStack_124) + (fVar121 - local_128);
    fVar159 = (fVar128 - fStack_120) + (fVar123 - fStack_124);
    fVar160 = (fVar129 - fStack_11c) + (fVar128 - fStack_120);
    fVar122 = (fVar129 - fStack_11c) + 0.0;
    auVar188._0_8_ =
         CONCAT44(fStack_124 * fVar108 - fStack_244 * fVar159,
                  local_128 * fVar89 - local_248 * fVar111);
    auVar188._8_4_ = fStack_120 * fVar110 - fStack_240 * fVar160;
    auVar188._12_4_ = fStack_11c * fVar120 - fStack_23c * fVar122;
    auVar133._0_4_ = fVar88 * fVar89 - local_228 * fVar111;
    auVar133._4_4_ = fVar90 * fVar108 - fStack_224 * fVar159;
    auVar133._8_4_ = fStack_3a0 * fVar110 - fStack_220 * fVar160;
    auVar133._12_4_ = fStack_39c * fVar120 - fStack_21c * fVar122;
    auVar150._0_8_ =
         CONCAT44((float)local_418._4_4_ * fVar108 - fVar159 * local_238._4_4_,
                  (float)local_418._0_4_ * fVar89 - fVar111 * local_238._0_4_);
    auVar150._8_4_ = fStack_410 * fVar110 - fVar160 * local_238._8_4_;
    auVar150._12_4_ = fVar120 * 0.0 - fVar122 * 0.0;
    auVar249._0_4_ = fVar89 * fStack_124 - fVar111 * fStack_244;
    auVar249._4_4_ = fVar108 * fStack_120 - fVar159 * fStack_240;
    auVar249._8_4_ = fVar110 * fStack_11c - fVar160 * fStack_23c;
    auVar249._12_4_ = fVar120 * 0.0 - fVar122 * 0.0;
    auVar215._0_8_ =
         CONCAT44(fVar123 * fVar108 - fVar143 * fVar159,fVar121 * fVar89 - fVar130 * fVar111);
    auVar215._8_4_ = fVar128 * fVar110 - fVar144 * fVar160;
    auVar215._12_4_ = fVar129 * fVar120 - fVar145 * fVar122;
    auVar258._0_4_ = local_e8 * fVar89 - local_118 * fVar111;
    auVar258._4_4_ = fStack_e4 * fVar108 - fStack_114 * fVar159;
    auVar258._8_4_ = fStack_e0 * fVar110 - fStack_110 * fVar160;
    auVar258._12_4_ = fStack_dc * fVar120 - fStack_10c * fVar122;
    auVar202._0_8_ =
         CONCAT44(local_108._4_4_ * fVar108 - fVar159 * local_b8._4_4_,
                  local_108._0_4_ * fVar89 - fVar111 * local_b8._0_4_);
    auVar202._8_4_ = local_108._8_4_ * fVar110 - fVar160 * local_b8._8_4_;
    auVar202._12_4_ = fVar120 * 0.0 - fVar122 * 0.0;
    auVar74._0_4_ = fVar89 * fVar123 - fVar111 * fVar143;
    auVar74._4_4_ = fVar108 * fVar128 - fVar159 * fVar144;
    auVar74._8_4_ = fVar110 * fVar129 - fVar160 * fVar145;
    auVar74._12_4_ = fVar120 * 0.0 - fVar122 * 0.0;
    auVar98._8_4_ = auVar188._8_4_;
    auVar98._0_8_ = auVar188._0_8_;
    auVar98._12_4_ = auVar188._12_4_;
    auVar60 = minps(auVar98,auVar133);
    auVar96 = maxps(auVar188,auVar133);
    auVar134._8_4_ = auVar150._8_4_;
    auVar134._0_8_ = auVar150._0_8_;
    auVar134._12_4_ = auVar150._12_4_;
    auVar214 = minps(auVar134,auVar249);
    auVar60 = minps(auVar60,auVar214);
    auVar214 = maxps(auVar150,auVar249);
    auVar113 = maxps(auVar96,auVar214);
    auVar135._8_4_ = auVar215._8_4_;
    auVar135._0_8_ = auVar215._0_8_;
    auVar135._12_4_ = auVar215._12_4_;
    auVar214 = minps(auVar135,auVar258);
    auVar216 = maxps(auVar215,auVar258);
    auVar151._8_4_ = auVar202._8_4_;
    auVar151._0_8_ = auVar202._0_8_;
    auVar151._12_4_ = auVar202._12_4_;
    auVar96 = minps(auVar151,auVar74);
    auVar214 = minps(auVar214,auVar96);
    auVar60 = minps(auVar60,auVar214);
    auVar214 = maxps(auVar202,auVar74);
    auVar214 = maxps(auVar216,auVar214);
    auVar214 = maxps(auVar113,auVar214);
    auVar189._0_4_ =
         -(uint)(local_148 <= auVar214._0_4_ && auVar60._0_4_ <= local_138) & local_158._0_4_;
    auVar189._4_4_ =
         -(uint)(fStack_144 <= auVar214._4_4_ && auVar60._4_4_ <= fStack_134) & local_158._4_4_;
    auVar189._8_4_ =
         -(uint)(fStack_140 <= auVar214._8_4_ && auVar60._8_4_ <= fStack_130) & local_158._8_4_;
    auVar189._12_4_ =
         -(uint)(fStack_13c <= auVar214._12_4_ && auVar60._12_4_ <= fStack_12c) & local_158._12_4_;
    uVar44 = movmskps((int)uVar39,auVar189);
    uVar39 = (ulong)uVar44;
    if (uVar44 != 0) {
      fVar89 = (fVar143 - fVar130) + (fStack_244 - local_248);
      fVar108 = (fVar144 - fVar143) + (fStack_240 - fStack_244);
      fVar110 = (fVar145 - fVar144) + (fStack_23c - fStack_240);
      fVar120 = (0.0 - fVar145) + (0.0 - fStack_23c);
      fVar111 = (fVar123 - fVar121) + (fStack_124 - local_128);
      fVar159 = (fVar128 - fVar123) + (fStack_120 - fStack_124);
      fVar160 = (fVar129 - fVar128) + (fStack_11c - fStack_120);
      fVar122 = (0.0 - fVar129) + (0.0 - fStack_11c);
      auVar262._0_8_ =
           CONCAT44(fStack_124 * fVar108 - fStack_244 * fVar159,
                    local_128 * fVar89 - local_248 * fVar111);
      auVar262._8_4_ = fStack_120 * fVar110 - fStack_240 * fVar160;
      auVar262._12_4_ = fStack_11c * fVar120 - fStack_23c * fVar122;
      auVar136._0_4_ = fVar88 * fVar89 - local_228 * fVar111;
      auVar136._4_4_ = fVar90 * fVar108 - fStack_224 * fVar159;
      auVar136._8_4_ = fStack_3a0 * fVar110 - fStack_220 * fVar160;
      auVar136._12_4_ = fStack_39c * fVar120 - fStack_21c * fVar122;
      auVar203._0_8_ =
           CONCAT44((float)local_418._4_4_ * fVar108 - local_238._4_4_ * fVar159,
                    (float)local_418._0_4_ * fVar89 - local_238._0_4_ * fVar111);
      auVar203._8_4_ = fStack_410 * fVar110 - local_238._8_4_ * fVar160;
      auVar203._12_4_ = fVar120 * 0.0 - fVar122 * 0.0;
      auVar152._0_4_ = fStack_124 * fVar89 - fStack_244 * fVar111;
      auVar152._4_4_ = fStack_120 * fVar108 - fStack_240 * fVar159;
      auVar152._8_4_ = fStack_11c * fVar110 - fStack_23c * fVar160;
      auVar152._12_4_ = fVar120 * 0.0 - fVar122 * 0.0;
      auVar118._0_8_ =
           CONCAT44(fVar123 * fVar108 - fVar143 * fVar159,fVar121 * fVar89 - fVar130 * fVar111);
      auVar118._8_4_ = fVar128 * fVar110 - fVar144 * fVar160;
      auVar118._12_4_ = fVar129 * fVar120 - fVar145 * fVar122;
      auVar217._0_4_ = local_e8 * fVar89 - local_118 * fVar111;
      auVar217._4_4_ = fStack_e4 * fVar108 - fStack_114 * fVar159;
      auVar217._8_4_ = fStack_e0 * fVar110 - fStack_110 * fVar160;
      auVar217._12_4_ = fStack_dc * fVar120 - fStack_10c * fVar122;
      auVar226._0_8_ =
           CONCAT44(local_108._4_4_ * fVar108 - local_b8._4_4_ * fVar159,
                    local_108._0_4_ * fVar89 - local_b8._0_4_ * fVar111);
      auVar226._8_4_ = local_108._8_4_ * fVar110 - local_b8._8_4_ * fVar160;
      auVar226._12_4_ = fVar120 * 0.0 - fVar122 * 0.0;
      auVar75._0_4_ = fVar89 * fVar123 - fVar111 * fVar143;
      auVar75._4_4_ = fVar108 * fVar128 - fVar159 * fVar144;
      auVar75._8_4_ = fVar110 * fVar129 - fVar160 * fVar145;
      auVar75._12_4_ = fVar120 * 0.0 - fVar122 * 0.0;
      auVar99._8_4_ = auVar262._8_4_;
      auVar99._0_8_ = auVar262._0_8_;
      auVar99._12_4_ = auVar262._12_4_;
      auVar60 = minps(auVar99,auVar136);
      auVar96 = maxps(auVar262,auVar136);
      auVar137._8_4_ = auVar203._8_4_;
      auVar137._0_8_ = auVar203._0_8_;
      auVar137._12_4_ = auVar203._12_4_;
      auVar214 = minps(auVar137,auVar152);
      auVar60 = minps(auVar60,auVar214);
      auVar214 = maxps(auVar203,auVar152);
      auVar216 = maxps(auVar96,auVar214);
      auVar138._8_4_ = auVar118._8_4_;
      auVar138._0_8_ = auVar118._0_8_;
      auVar138._12_4_ = auVar118._12_4_;
      auVar96 = minps(auVar138,auVar217);
      auVar214 = maxps(auVar118,auVar217);
      auVar153._8_4_ = auVar226._8_4_;
      auVar153._0_8_ = auVar226._0_8_;
      auVar153._12_4_ = auVar226._12_4_;
      auVar113 = minps(auVar153,auVar75);
      auVar96 = minps(auVar96,auVar113);
      auVar60 = minps(auVar60,auVar96);
      auVar96 = maxps(auVar226,auVar75);
      auVar214 = maxps(auVar214,auVar96);
      auVar214 = maxps(auVar216,auVar214);
      auVar263._0_4_ =
           -(uint)(local_148 <= auVar214._0_4_ && auVar60._0_4_ <= local_138) & auVar189._0_4_;
      auVar263._4_4_ =
           -(uint)(fStack_144 <= auVar214._4_4_ && auVar60._4_4_ <= fStack_134) & auVar189._4_4_;
      auVar263._8_4_ =
           -(uint)(fStack_140 <= auVar214._8_4_ && auVar60._8_4_ <= fStack_130) & auVar189._8_4_;
      auVar263._12_4_ =
           -(uint)(fStack_13c <= auVar214._12_4_ && auVar60._12_4_ <= fStack_12c) & auVar189._12_4_;
      uVar44 = movmskps(uVar44,auVar263);
      uVar39 = (ulong)uVar44;
      if (uVar44 != 0) {
        afStack_1e8[uVar41] = (float)(uVar44 & 0xff);
        *(ulong *)(afStack_78 + uVar41 * 2) = CONCAT44(fStack_3e4,local_3e8);
        *(ulong *)(afStack_58 + uVar41 * 2) = CONCAT44(fVar51,fVar109);
        uVar39 = uVar41;
        uVar41 = (ulong)((int)uVar41 + 1);
      }
    }
LAB_00a9005e:
    auVar60 = _local_418;
    if ((int)uVar41 == 0) {
      if (bVar36 != false) {
        return bVar36;
      }
      fVar109 = ray->tfar;
      auVar107._4_4_ = -(uint)(fStack_164 <= fVar109);
      auVar107._0_4_ = -(uint)(local_168 <= fVar109);
      auVar107._8_4_ = -(uint)(fStack_160 <= fVar109);
      auVar107._12_4_ = -(uint)(fStack_15c <= fVar109);
      uVar44 = movmskps((int)uVar39,auVar107);
      uVar44 = (uint)uVar43 & uVar44;
      if (uVar44 == 0) {
        return false;
      }
      goto LAB_00a8f179;
    }
    uVar42 = (ulong)((int)uVar41 - 1);
    fVar88 = afStack_1e8[uVar42];
    fVar109 = afStack_58[uVar42 * 2];
    fVar51 = afStack_58[uVar42 * 2 + 1];
    uVar11 = 0;
    if (fVar88 != 0.0) {
      for (; ((uint)fVar88 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    fVar88 = (float)((int)fVar88 - 1U & (uint)fVar88);
    afStack_1e8[uVar42] = fVar88;
    if (fVar88 == 0.0) {
      uVar41 = uVar42;
    }
    uVar38 = uVar11 + 1;
    uVar39 = uVar38;
    if ((long)uVar38 < 0) {
      uVar39 = (ulong)((uint)uVar38 & 1) | uVar38 >> 1;
    }
    fVar88 = afStack_78[uVar42 * 2];
    fVar89 = afStack_78[uVar42 * 2 + 1];
    local_3e8 = fVar88 * (1.0 - (float)uVar11 * 0.33333334) + fVar89 * (float)uVar11 * 0.33333334;
    fStack_3e4 = fVar88 * (1.0 - (float)uVar38 * 0.33333334) + fVar89 * (float)uVar38 * 0.33333334;
    fStack_3e0 = fVar88 * 0.0 + fVar89 * 0.0;
    fStack_3dc = fVar88 * 0.0 + fVar89 * 0.0;
    fVar88 = fStack_3e4 - local_3e8;
    if (fVar88 < 0.16666667) {
      fVar129 = 1.0 - fVar109;
      fVar130 = 1.0 - fVar109;
      fVar143 = 1.0 - fVar51;
      fVar144 = 1.0 - fVar51;
      fVar89 = (float)local_2c8._0_4_ * fVar129 + local_308 * fVar109;
      fVar90 = (float)local_2c8._4_4_ * fVar130 + fStack_304 * fVar109;
      fVar108 = fStack_2c0 * fVar143 + fStack_300 * fVar51;
      fVar110 = fStack_2bc * fVar144 + fStack_2fc * fVar51;
      fVar120 = (float)local_2d8._0_4_ * fVar129 + (float)local_318._0_4_ * fVar109;
      fVar121 = (float)local_2d8._4_4_ * fVar130 + (float)local_318._4_4_ * fVar109;
      fVar123 = fStack_2d0 * fVar143 + fStack_310 * fVar51;
      fVar128 = fStack_2cc * fVar144 + fStack_30c * fVar51;
      fVar196 = local_2e8 * fVar129 + local_328 * fVar109;
      fVar210 = fStack_2e4 * fVar130 + fStack_324 * fVar109;
      fVar212 = fStack_2e0 * fVar143 + fStack_320 * fVar51;
      fVar224 = fStack_2dc * fVar144 + fStack_31c * fVar51;
      fVar168 = (fVar129 * (float)local_2f8._0_4_ + fVar109 * (float)local_338._0_4_) - fVar196;
      fVar169 = (fVar130 * (float)local_2f8._4_4_ + fVar109 * (float)local_338._4_4_) - fVar210;
      fVar170 = (fVar143 * fStack_2f0 + fVar51 * fStack_330) - fVar212;
      fVar195 = (fVar144 * fStack_2ec + fVar51 * fStack_32c) - fVar224;
      fVar145 = local_3e8 * (fVar196 - fVar120) + fVar120;
      fVar111 = local_3e8 * (fVar210 - fVar121) + fVar121;
      fVar122 = local_3e8 * (fVar212 - fVar123) + fVar123;
      fVar161 = local_3e8 * (fVar224 - fVar128) + fVar128;
      fVar197 = (fVar196 - fVar120) * fStack_3e4 + fVar120;
      fVar211 = (fVar210 - fVar121) * fStack_3e4 + fVar121;
      fVar223 = (fVar212 - fVar123) * fStack_3e4 + fVar123;
      fVar225 = (fVar224 - fVar128) * fStack_3e4 + fVar128;
      fVar129 = local_3e8 * (fVar120 - fVar89) + fVar89;
      fVar130 = local_3e8 * (fVar121 - fVar90) + fVar90;
      fVar143 = local_3e8 * (fVar123 - fVar108) + fVar108;
      fVar144 = local_3e8 * (fVar128 - fVar110) + fVar110;
      fVar129 = (fVar145 - fVar129) * local_3e8 + fVar129;
      fVar130 = (fVar111 - fVar130) * local_3e8 + fVar130;
      fVar143 = (fVar122 - fVar143) * local_3e8 + fVar143;
      fVar144 = (fVar161 - fVar144) * local_3e8 + fVar144;
      fVar159 = (((local_3e8 * fVar168 + fVar196) - fVar145) * local_3e8 + fVar145) - fVar129;
      fVar160 = (((local_3e8 * fVar169 + fVar210) - fVar111) * local_3e8 + fVar111) - fVar130;
      fVar122 = (((local_3e8 * fVar170 + fVar212) - fVar122) * local_3e8 + fVar122) - fVar143;
      fVar161 = (((local_3e8 * fVar195 + fVar224) - fVar161) * local_3e8 + fVar161) - fVar144;
      fVar129 = local_3e8 * fVar159 + fVar129;
      fVar130 = local_3e8 * fVar160 + fVar130;
      fVar143 = local_3e8 * fVar122 + fVar143;
      fVar144 = local_3e8 * fVar161 + fVar144;
      auVar100._0_4_ = (fVar120 - fVar89) * fStack_3e4 + fVar89;
      auVar100._4_4_ = (fVar121 - fVar90) * fStack_3e4 + fVar90;
      auVar100._8_4_ = (fVar123 - fVar108) * fStack_3e4 + fVar108;
      auVar100._12_4_ = (fVar128 - fVar110) * fStack_3e4 + fVar110;
      fVar145 = (fVar197 - auVar100._0_4_) * fStack_3e4 + auVar100._0_4_;
      fVar111 = (fVar211 - auVar100._4_4_) * fStack_3e4 + auVar100._4_4_;
      local_398 = (fVar223 - auVar100._8_4_) * fStack_3e4 + auVar100._8_4_;
      fStack_394 = (fVar225 - auVar100._12_4_) * fStack_3e4 + auVar100._12_4_;
      fVar90 = (((fVar168 * fStack_3e4 + fVar196) - fVar197) * fStack_3e4 + fVar197) - fVar145;
      fVar108 = (((fVar169 * fStack_3e4 + fVar210) - fVar211) * fStack_3e4 + fVar211) - fVar111;
      fVar110 = (((fVar170 * fStack_3e4 + fVar212) - fVar223) * fStack_3e4 + fVar223) - local_398;
      fVar120 = (((fVar195 * fStack_3e4 + fVar224) - fVar225) * fStack_3e4 + fVar225) - fStack_394;
      fVar145 = fStack_3e4 * fVar90 + fVar145;
      fVar111 = fStack_3e4 * fVar108 + fVar111;
      local_398 = fStack_3e4 * fVar110 + local_398;
      fStack_394 = fStack_3e4 * fVar120 + fStack_394;
      fVar89 = fVar88 * 0.33333334;
      fVar159 = fVar159 * (float)DAT_01f7ff50 * fVar89 + fVar129;
      fVar160 = fVar160 * DAT_01f7ff50._4_4_ * fVar89 + fVar130;
      fVar122 = fVar122 * DAT_01f7ff50._8_4_ * fVar89 + fVar143;
      fVar161 = fVar161 * DAT_01f7ff50._12_4_ * fVar89 + fVar144;
      fVar168 = fVar145 - fVar89 * fVar90 * (float)DAT_01f7ff50;
      fVar169 = fVar111 - fVar89 * fVar108 * DAT_01f7ff50._4_4_;
      fVar170 = local_398 - fVar89 * fVar110 * DAT_01f7ff50._8_4_;
      fVar195 = fStack_394 - fVar89 * fVar120 * DAT_01f7ff50._12_4_;
      auVar14._4_8_ = auVar100._8_8_;
      auVar14._0_4_ = fVar130;
      auVar101._0_8_ = auVar14._0_8_ << 0x20;
      auVar101._8_4_ = fVar143;
      auVar101._12_4_ = fVar144;
      auVar15._4_8_ = DAT_01f7ff50._8_8_;
      auVar15._0_4_ = fVar111;
      auVar204._0_8_ = auVar15._0_8_ << 0x20;
      auVar204._8_4_ = local_398;
      auVar204._12_4_ = fStack_394;
      local_418 = (undefined1  [8])auVar101._8_8_;
      fVar120 = (local_398 - fVar145) + (fVar143 - fVar129);
      fVar121 = (fStack_394 - fVar111) + (fVar144 - fVar130);
      auVar218._0_4_ = fVar169 * fVar121;
      auVar218._4_4_ = fVar169 * fVar121;
      auVar218._8_4_ = fVar195 * fVar121;
      auVar218._12_4_ = fVar195 * fVar121;
      fVar89 = fVar129 * fVar120 + fVar130 * fVar121;
      fVar90 = fVar143 * fVar120 + fVar144 * fVar121;
      fVar123 = fVar159 * fVar120 + fVar160 * fVar121;
      fVar128 = fVar122 * fVar120 + fVar161 * fVar121;
      fVar196 = fVar168 * fVar120 + auVar218._0_4_;
      auVar190._0_8_ = CONCAT44(fVar169 * fVar120 + auVar218._4_4_,fVar196);
      auVar190._8_4_ = fVar170 * fVar120 + auVar218._8_4_;
      auVar190._12_4_ = fVar195 * fVar120 + auVar218._12_4_;
      fVar110 = fVar120 * fVar145 + fVar121 * fVar111;
      fVar197 = fVar120 * local_398 + fVar121 * fStack_394;
      auVar16._4_8_ = auVar218._8_8_;
      auVar16._0_4_ = fVar160 * fVar120 + fVar160 * fVar121;
      auVar219._0_8_ = auVar16._0_8_ << 0x20;
      auVar219._8_4_ = fVar128;
      auVar219._12_4_ = fVar161 * fVar120 + fVar161 * fVar121;
      fVar108 = fVar123;
      if (fVar123 <= fVar89) {
        fVar108 = fVar89;
        fVar89 = fVar123;
      }
      auVar220._8_8_ = auVar219._8_8_;
      auVar220._0_8_ = auVar220._8_8_;
      auVar76._8_4_ = auVar190._8_4_;
      auVar76._0_8_ = auVar190._0_8_;
      auVar76._12_4_ = auVar190._12_4_;
      if (fVar110 <= fVar196) {
        auVar76._0_4_ = fVar110;
      }
      if (auVar76._0_4_ <= fVar89) {
        fVar89 = auVar76._0_4_;
      }
      auVar17._4_8_ = auVar76._8_8_;
      auVar17._0_4_ = fVar120 * fVar111 + fVar121 * fVar111;
      auVar77._0_8_ = auVar17._0_8_ << 0x20;
      auVar77._8_4_ = fVar197;
      auVar77._12_4_ = fVar120 * fStack_394 + fVar121 * fStack_394;
      if (fVar110 <= fVar196) {
        fVar110 = fVar196;
      }
      auVar78._8_8_ = auVar77._8_8_;
      auVar78._0_8_ = auVar78._8_8_;
      if (fVar110 <= fVar108) {
        fVar110 = fVar108;
      }
      if (fVar128 <= fVar90) {
        auVar220._0_4_ = fVar90;
        fVar90 = fVar128;
      }
      auVar102._8_4_ = auVar190._8_4_;
      auVar102._0_8_ = auVar190._8_8_;
      auVar102._12_4_ = auVar190._12_4_;
      if (fVar197 <= auVar190._8_4_) {
        auVar102._0_4_ = fVar197;
      }
      if (auVar102._0_4_ <= fVar90) {
        fVar90 = auVar102._0_4_;
      }
      if (fVar197 <= auVar190._8_4_) {
        auVar78._0_4_ = auVar190._8_4_;
      }
      if (auVar78._0_4_ <= auVar220._0_4_) {
        auVar78._0_4_ = auVar220._0_4_;
      }
      fVar108 = auVar78._0_4_;
      if ((0.0001 <= fVar89) || (fVar108 <= -0.0001)) break;
      goto LAB_00a903c5;
    }
  } while( true );
  if ((fVar90 < 0.0001 && -0.0001 < fVar110) ||
     ((fVar89 < 0.0001 && -0.0001 < fVar110 ||
      (uVar39 = CONCAT71((int7)(uVar39 >> 8),fVar88 < 0.001), fVar90 < 0.0001 && -0.0001 < fVar108))
     )) {
LAB_00a903c5:
    local_3a8 = auVar204._8_8_;
    fVar121 = (float)(~-(uint)(fVar89 < 0.0) & 0x3f800000 | -(uint)(fVar89 < 0.0) & 0xbf800000);
    fVar123 = (float)(~-(uint)(fVar110 < 0.0) & 0x3f800000 | -(uint)(fVar110 < 0.0) & 0xbf800000);
    fVar120 = 0.0;
    if ((fVar121 == fVar123) && (!NAN(fVar121) && !NAN(fVar123))) {
      fVar120 = INFINITY;
    }
    fVar128 = 0.0;
    if ((fVar121 == fVar123) && (!NAN(fVar121) && !NAN(fVar123))) {
      fVar128 = -INFINITY;
    }
    fVar196 = (float)(~-(uint)(fVar90 < 0.0) & 0x3f800000 | -(uint)(fVar90 < 0.0) & 0xbf800000);
    if ((fVar121 != fVar196) || (fVar197 = fVar128, NAN(fVar121) || NAN(fVar196))) {
      if ((fVar90 != fVar89) || (NAN(fVar90) || NAN(fVar89))) {
        fVar90 = -fVar89 / (fVar90 - fVar89);
        fVar90 = (1.0 - fVar90) * 0.0 + fVar90;
        fVar197 = fVar90;
      }
      else {
        fVar90 = 0.0;
        if ((fVar89 != 0.0) || (fVar197 = 1.0, NAN(fVar89))) {
          fVar90 = INFINITY;
          fVar197 = -INFINITY;
        }
      }
      if (fVar90 <= fVar120) {
        fVar120 = fVar90;
      }
      if (fVar197 <= fVar128) {
        fVar197 = fVar128;
      }
    }
    uVar39 = (ulong)(fVar108 < 0.0);
    fVar89 = *(float *)(&DAT_01f80eb4 + uVar39 * 4);
    if ((fVar123 != fVar89) || (fVar90 = fVar197, NAN(fVar123) || NAN(fVar89))) {
      if ((fVar108 != fVar110) || (NAN(fVar108) || NAN(fVar110))) {
        fVar121 = -fVar110 / (fVar108 - fVar110);
        fVar121 = (1.0 - fVar121) * 0.0 + fVar121;
        fVar90 = fVar121;
      }
      else {
        fVar121 = 0.0;
        if ((fVar110 != 0.0) || (fVar90 = 1.0, NAN(fVar110))) {
          fVar121 = INFINITY;
          fVar90 = -INFINITY;
        }
      }
      if (fVar121 <= fVar120) {
        fVar120 = fVar121;
      }
      if (fVar90 <= fVar197) {
        fVar90 = fVar197;
      }
    }
    if ((fVar196 != fVar89) || (NAN(fVar196) || NAN(fVar89))) {
      fVar120 = (float)(~-(uint)(fVar120 < 1.0) & 0x3f800000 |
                       (uint)fVar120 & -(uint)(fVar120 < 1.0));
      fVar90 = (float)(~-(uint)(fVar90 < 1.0) & (uint)fVar90 | -(uint)(fVar90 < 1.0) & 0x3f800000);
    }
    fVar120 = (float)(~-(uint)(fVar120 < 0.0) & (uint)fVar120);
    fVar89 = (float)(~-(uint)(fVar90 < 1.0) & 0x3f800000 | (uint)fVar90 & -(uint)(fVar90 < 1.0));
    if (fVar120 <= fVar89) {
      fVar120 = fVar120 + -0.1;
      fVar89 = fVar89 + 0.1;
      uVar44 = -(uint)(fVar89 < 1.0);
      fVar120 = (float)(~-(uint)(fVar120 < 0.0) & (uint)fVar120);
      fVar89 = (float)(~uVar44 & 0x3f800000 | (uint)fVar89 & uVar44);
      fVar196 = 1.0 - fVar120;
      fVar197 = 1.0 - fVar120;
      fVar210 = 1.0 - fVar89;
      fVar211 = 1.0 - fVar89;
      fStack_410 = auVar60._8_4_;
      fStack_40c = auVar60._12_4_;
      fVar90 = fVar129 * fVar196 + fVar143 * fVar120;
      fVar110 = fVar130 * fVar197 + fVar144 * fVar120;
      fVar121 = fVar129 * fVar210 + fStack_410 * fVar89;
      fVar123 = fVar130 * fVar211 + fStack_40c * fVar89;
      fVar128 = fVar159 * fVar196 + fVar122 * fVar120;
      fVar129 = fVar160 * fVar197 + fVar161 * fVar120;
      fVar130 = fVar159 * fVar210 + fVar122 * fVar89;
      fVar143 = fVar160 * fVar211 + fVar161 * fVar89;
      fVar144 = fVar168 * fVar196 + fVar170 * fVar120;
      fVar159 = fVar169 * fVar197 + fVar195 * fVar120;
      fVar160 = fVar168 * fVar210 + fVar170 * fVar89;
      fVar122 = fVar169 * fVar211 + fVar195 * fVar89;
      fVar161 = fVar196 * fVar145 + local_398 * fVar120;
      fVar168 = fVar197 * fVar111 + fStack_394 * fVar120;
      fVar145 = fVar210 * fVar145 + fStack_3a0 * fVar89;
      fVar169 = fVar211 * fVar111 + fStack_39c * fVar89;
      fVar111 = fVar109 * (1.0 - fVar89);
      fVar109 = fVar109 * (1.0 - fVar120) + fVar51 * fVar120;
      fVar51 = fVar111 + fVar51 * fVar89;
      fVar111 = 1.0 / fVar88;
      auVar103._0_4_ = fVar145 - fVar161;
      auVar103._4_4_ = fVar169 - fVar168;
      auVar103._8_4_ = fVar145 - fVar145;
      auVar103._12_4_ = fVar169 - fVar169;
      auVar126._0_8_ = CONCAT44(fVar122 - fVar159,fVar160 - fVar144);
      auVar126._8_4_ = fVar160 - fVar160;
      auVar126._12_4_ = fVar122 - fVar122;
      auVar154._0_4_ = fVar130 - fVar128;
      auVar154._4_4_ = fVar143 - fVar129;
      auVar154._8_4_ = fVar130 - fVar130;
      auVar154._12_4_ = fVar143 - fVar143;
      auVar221._0_8_ = CONCAT44((fVar129 - fVar110) * 3.0,(fVar128 - fVar90) * 3.0);
      auVar221._8_4_ = (fVar130 - fVar121) * 3.0;
      auVar221._12_4_ = (fVar143 - fVar123) * 3.0;
      auVar139._0_8_ = CONCAT44((fVar159 - fVar129) * 3.0,(fVar144 - fVar128) * 3.0);
      auVar139._8_4_ = (fVar160 - fVar130) * 3.0;
      auVar139._12_4_ = (fVar122 - fVar143) * 3.0;
      auVar238._0_4_ = (fVar161 - fVar144) * 3.0;
      auVar238._4_4_ = (fVar168 - fVar159) * 3.0;
      auVar238._8_4_ = (fVar145 - fVar160) * 3.0;
      auVar238._12_4_ = (fVar169 - fVar122) * 3.0;
      auVar191._8_4_ = auVar139._8_4_;
      auVar191._0_8_ = auVar139._0_8_;
      auVar191._12_4_ = auVar139._12_4_;
      auVar214 = minps(auVar191,auVar238);
      auVar60 = maxps(auVar139,auVar238);
      auVar227._8_4_ = auVar221._8_4_;
      auVar227._0_8_ = auVar221._0_8_;
      auVar227._12_4_ = auVar221._12_4_;
      auVar113 = minps(auVar227,auVar214);
      auVar96 = maxps(auVar221,auVar60);
      auVar18._4_8_ = auVar60._8_8_;
      auVar18._0_4_ = auVar113._4_4_;
      auVar140._0_8_ = auVar18._0_8_ << 0x20;
      auVar140._8_4_ = auVar113._8_4_;
      auVar140._12_4_ = auVar113._12_4_;
      auVar141._8_8_ = auVar113._8_8_;
      auVar141._0_8_ = auVar140._8_8_;
      auVar19._4_8_ = auVar214._8_8_;
      auVar19._0_4_ = auVar96._4_4_;
      auVar192._0_8_ = auVar19._0_8_ << 0x20;
      auVar192._8_4_ = auVar96._8_4_;
      auVar192._12_4_ = auVar96._12_4_;
      auVar193._8_8_ = auVar96._8_8_;
      auVar193._0_8_ = auVar192._8_8_;
      auVar214 = minps(auVar113,auVar141);
      auVar60 = maxps(auVar96,auVar193);
      fVar211 = auVar214._0_4_ * fVar111;
      fVar212 = auVar214._4_4_ * fVar111;
      fVar223 = auVar214._8_4_ * fVar111;
      fVar224 = auVar214._12_4_ * fVar111;
      fVar159 = fVar111 * auVar60._0_4_;
      fVar122 = fVar111 * auVar60._4_4_;
      fVar168 = fVar111 * auVar60._8_4_;
      fVar111 = fVar111 * auVar60._12_4_;
      fVar197 = 1.0 / (fVar51 - fVar109);
      auVar79._0_8_ = CONCAT44(fVar123 - fVar110,fVar121 - fVar90);
      auVar79._8_4_ = fVar121 - fVar121;
      auVar79._12_4_ = fVar123 - fVar123;
      auVar205._8_4_ = auVar79._8_4_;
      auVar205._0_8_ = auVar79._0_8_;
      auVar205._12_4_ = auVar79._12_4_;
      auVar96 = minps(auVar205,auVar154);
      auVar60 = maxps(auVar79,auVar154);
      auVar119._8_4_ = auVar126._8_4_;
      auVar119._0_8_ = auVar126._0_8_;
      auVar119._12_4_ = auVar126._12_4_;
      auVar214 = minps(auVar119,auVar103);
      auVar96 = minps(auVar96,auVar214);
      auVar214 = maxps(auVar126,auVar103);
      auVar60 = maxps(auVar60,auVar214);
      fVar195 = auVar96._0_4_ * fVar197;
      fVar196 = auVar96._4_4_ * fVar197;
      fVar210 = fVar197 * auVar60._0_4_;
      fVar197 = fVar197 * auVar60._4_4_;
      local_418._4_4_ = fVar109;
      local_418._0_4_ = local_3e8;
      fStack_410 = fStack_3e4;
      fStack_40c = fVar51;
      auVar194._4_4_ = fVar51;
      auVar194._0_4_ = fStack_3e4;
      auVar194._8_4_ = fStack_3e0;
      auVar194._12_4_ = fStack_3dc;
      local_1cc = (local_3e8 + fStack_3e4) * 0.5;
      fVar130 = (fVar109 + fVar51) * 0.5;
      fVar143 = (fStack_3e4 + fStack_3e0) * 0.0;
      fVar144 = (fVar51 + fStack_3dc) * 0.0;
      fVar89 = local_88 * local_1cc + (float)local_1f8;
      fVar90 = fStack_84 * local_1cc + local_1f8._4_4_;
      fVar110 = fStack_80 * local_1cc + fStack_1f0;
      fVar120 = fStack_7c * local_1cc + fStack_1ec;
      fVar121 = local_98 * local_1cc + local_2a8;
      fVar123 = fStack_94 * local_1cc + fStack_2a4;
      fVar128 = fStack_90 * local_1cc + (float)uStack_2a0;
      fVar129 = fStack_8c * local_1cc + uStack_2a0._4_4_;
      fVar89 = (fVar121 - fVar89) * local_1cc + fVar89;
      fVar90 = (fVar123 - fVar90) * local_1cc + fVar90;
      fVar110 = (fVar128 - fVar110) * local_1cc + fVar110;
      fVar120 = (fVar129 - fVar120) * local_1cc + fVar120;
      fVar121 = (((local_a8 * local_1cc + (float)local_2b8) - fVar121) * local_1cc + fVar121) -
                fVar89;
      fVar123 = (((fStack_a4 * local_1cc + local_2b8._4_4_) - fVar123) * local_1cc + fVar123) -
                fVar90;
      fVar128 = (((fStack_a0 * local_1cc + fStack_2b0) - fVar128) * local_1cc + fVar128) - fVar110;
      fVar129 = (((fStack_9c * local_1cc + fStack_2ac) - fVar129) * local_1cc + fVar129) - fVar120;
      fVar89 = local_1cc * fVar121 + fVar89;
      fVar90 = local_1cc * fVar123 + fVar90;
      fVar121 = fVar121 * 3.0;
      fVar123 = fVar123 * 3.0;
      fVar110 = (local_1cc * fVar128 + fVar110) - fVar89;
      fVar120 = (local_1cc * fVar129 + fVar120) - fVar90;
      fVar121 = (fVar128 * 3.0 - fVar121) * fVar130 + fVar121;
      fVar123 = (fVar129 * 3.0 - fVar123) * fVar130 + fVar123;
      auVar127._0_8_ = CONCAT44(fVar121,fVar110) ^ 0x80000000;
      auVar127._8_4_ = fVar121;
      auVar127._12_4_ = fVar121;
      fVar225 = local_3e8 - local_1cc;
      fVar231 = fVar109 - fVar130;
      fVar232 = fStack_3e4 - fVar143;
      fVar235 = fVar51 - fVar144;
      fVar242 = fStack_3e4 - local_1cc;
      fVar243 = fVar51 - fVar130;
      fVar143 = fStack_3e0 - fVar143;
      fVar144 = fStack_3dc - fVar144;
      fVar89 = fVar110 * fVar130 + fVar89;
      fVar90 = fVar120 * fVar130 + fVar90;
      auVar142._0_8_ = CONCAT44(fVar123,fVar120) ^ 0x8000000000000000;
      auVar142._8_4_ = -fVar123;
      auVar142._12_4_ = -fVar123;
      auVar80._0_4_ = fVar120 * fVar121 - fVar123 * fVar110;
      auVar80._4_4_ = auVar80._0_4_;
      auVar80._8_4_ = auVar80._0_4_;
      auVar80._12_4_ = auVar80._0_4_;
      auVar214 = divps(auVar142,auVar80);
      auVar60 = divps(auVar127,auVar80);
      fVar129 = auVar214._0_4_;
      fVar145 = auVar214._4_4_;
      fVar123 = auVar60._0_4_;
      fVar128 = auVar60._4_4_;
      local_1cc = local_1cc - (fVar90 * fVar123 + fVar89 * fVar129);
      fStack_1c8 = fVar130 - (fVar90 * fVar128 + fVar89 * fVar145);
      fVar121 = fVar130 - (fVar90 * auVar60._8_4_ + fVar89 * auVar214._8_4_);
      fVar130 = fVar130 - (fVar90 * auVar60._12_4_ + fVar89 * auVar214._12_4_);
      auVar104._0_8_ = CONCAT44(fVar145 * fVar195,fVar145 * fVar211);
      auVar104._8_4_ = fVar145 * fVar212;
      auVar104._12_4_ = fVar145 * fVar196;
      auVar81._0_4_ = fVar145 * fVar159;
      auVar81._4_4_ = fVar145 * fVar210;
      auVar81._8_4_ = fVar145 * fVar122;
      auVar81._12_4_ = fVar145 * fVar197;
      auVar265._8_4_ = auVar104._8_4_;
      auVar265._0_8_ = auVar104._0_8_;
      auVar265._12_4_ = auVar104._12_4_;
      auVar113 = minps(auVar265,auVar81);
      auVar60 = maxps(auVar81,auVar104);
      auVar155._0_8_ = CONCAT44(fVar128 * fVar196,fVar128 * fVar212);
      auVar155._8_4_ = fVar128 * fVar223;
      auVar155._12_4_ = fVar128 * fVar224;
      auVar105._0_4_ = fVar128 * fVar122;
      auVar105._4_4_ = fVar128 * fVar197;
      auVar105._8_4_ = fVar128 * fVar168;
      auVar105._12_4_ = fVar128 * fVar111;
      auVar228._8_4_ = auVar155._8_4_;
      auVar228._0_8_ = auVar155._0_8_;
      auVar228._12_4_ = auVar155._12_4_;
      auVar96 = minps(auVar228,auVar105);
      auVar214 = maxps(auVar105,auVar155);
      fVar89 = 0.0 - (auVar214._0_4_ + auVar60._0_4_);
      fVar90 = 1.0 - (auVar214._4_4_ + auVar60._4_4_);
      fVar110 = 0.0 - (auVar214._8_4_ + auVar60._8_4_);
      fVar120 = 0.0 - (auVar214._12_4_ + auVar60._12_4_);
      fVar160 = 0.0 - (auVar96._0_4_ + auVar113._0_4_);
      fVar161 = 1.0 - (auVar96._4_4_ + auVar113._4_4_);
      fVar169 = 0.0 - (auVar96._8_4_ + auVar113._8_4_);
      fVar170 = 0.0 - (auVar96._12_4_ + auVar113._12_4_);
      auVar106._0_8_ = CONCAT44(fVar231 * fVar90,fVar225 * fVar89);
      auVar106._8_4_ = fVar232 * fVar110;
      auVar106._12_4_ = fVar235 * fVar120;
      auVar239._0_8_ = CONCAT44(fVar195 * fVar129,fVar211 * fVar129);
      auVar239._8_4_ = fVar212 * fVar129;
      auVar239._12_4_ = fVar196 * fVar129;
      auVar156._0_4_ = fVar129 * fVar159;
      auVar156._4_4_ = fVar129 * fVar210;
      auVar156._8_4_ = fVar129 * fVar122;
      auVar156._12_4_ = fVar129 * fVar197;
      auVar229._8_4_ = auVar239._8_4_;
      auVar229._0_8_ = auVar239._0_8_;
      auVar229._12_4_ = auVar239._12_4_;
      auVar214 = minps(auVar229,auVar156);
      auVar60 = maxps(auVar156,auVar239);
      auVar206._0_8_ = CONCAT44(fVar196 * fVar123,fVar212 * fVar123);
      auVar206._8_4_ = fVar223 * fVar123;
      auVar206._12_4_ = fVar224 * fVar123;
      auVar240._0_4_ = fVar123 * fVar122;
      auVar240._4_4_ = fVar123 * fVar197;
      auVar240._8_4_ = fVar123 * fVar168;
      auVar240._12_4_ = fVar123 * fVar111;
      auVar264._8_4_ = auVar206._8_4_;
      auVar264._0_8_ = auVar206._0_8_;
      auVar264._12_4_ = auVar206._12_4_;
      auVar113 = minps(auVar264,auVar240);
      auVar230._0_4_ = fVar225 * fVar160;
      auVar230._4_4_ = fVar231 * fVar161;
      auVar230._8_4_ = fVar232 * fVar169;
      auVar230._12_4_ = fVar235 * fVar170;
      auVar82._0_8_ = CONCAT44(fVar90 * fVar243,fVar89 * fVar242);
      auVar82._8_4_ = fVar110 * fVar143;
      auVar82._12_4_ = fVar120 * fVar144;
      auVar167._0_4_ = fVar160 * fVar242;
      auVar167._4_4_ = fVar161 * fVar243;
      auVar167._8_4_ = fVar169 * fVar143;
      auVar167._12_4_ = fVar170 * fVar144;
      auVar96 = maxps(auVar240,auVar206);
      fVar89 = 1.0 - (auVar96._0_4_ + auVar60._0_4_);
      fVar90 = 0.0 - (auVar96._4_4_ + auVar60._4_4_);
      fVar110 = 0.0 - (auVar96._8_4_ + auVar60._8_4_);
      fVar120 = 0.0 - (auVar96._12_4_ + auVar60._12_4_);
      fVar111 = 1.0 - (auVar113._0_4_ + auVar214._0_4_);
      fVar159 = 0.0 - (auVar113._4_4_ + auVar214._4_4_);
      fVar160 = 0.0 - (auVar113._8_4_ + auVar214._8_4_);
      fVar122 = 0.0 - (auVar113._12_4_ + auVar214._12_4_);
      auVar207._0_8_ = CONCAT44(fVar231 * fVar90,fVar225 * fVar89);
      auVar207._8_4_ = fVar232 * fVar110;
      auVar207._12_4_ = fVar235 * fVar120;
      auVar250._0_4_ = fVar225 * fVar111;
      auVar250._4_4_ = fVar231 * fVar159;
      auVar250._8_4_ = fVar232 * fVar160;
      auVar250._12_4_ = fVar235 * fVar122;
      auVar157._0_8_ = CONCAT44(fVar90 * fVar243,fVar89 * fVar242);
      auVar157._8_4_ = fVar110 * fVar143;
      auVar157._12_4_ = fVar120 * fVar144;
      auVar222._0_4_ = fVar111 * fVar242;
      auVar222._4_4_ = fVar159 * fVar243;
      auVar222._8_4_ = fVar160 * fVar143;
      auVar222._12_4_ = fVar122 * fVar144;
      auVar241._8_4_ = auVar207._8_4_;
      auVar241._0_8_ = auVar207._0_8_;
      auVar241._12_4_ = auVar207._12_4_;
      auVar60 = minps(auVar241,auVar250);
      auVar259._8_4_ = auVar157._8_4_;
      auVar259._0_8_ = auVar157._0_8_;
      auVar259._12_4_ = auVar157._12_4_;
      auVar214 = minps(auVar259,auVar222);
      auVar216 = minps(auVar60,auVar214);
      auVar214 = maxps(auVar250,auVar207);
      auVar60 = maxps(auVar222,auVar157);
      auVar96 = maxps(auVar60,auVar214);
      auVar208._8_4_ = auVar106._8_4_;
      auVar208._0_8_ = auVar106._0_8_;
      auVar208._12_4_ = auVar106._12_4_;
      auVar214 = minps(auVar208,auVar230);
      auVar158._8_4_ = auVar82._8_4_;
      auVar158._0_8_ = auVar82._0_8_;
      auVar158._12_4_ = auVar82._12_4_;
      auVar60 = minps(auVar158,auVar167);
      auVar214 = minps(auVar214,auVar60);
      auVar113 = maxps(auVar230,auVar106);
      auVar60 = maxps(auVar167,auVar82);
      auVar60 = maxps(auVar60,auVar113);
      auVar209._0_4_ = auVar216._4_4_ + auVar216._0_4_ + local_1cc;
      auVar209._4_4_ = auVar214._4_4_ + auVar214._0_4_ + fStack_1c8;
      auVar209._8_4_ = auVar216._8_4_ + auVar216._4_4_ + fVar121;
      auVar209._12_4_ = auVar216._12_4_ + auVar214._4_4_ + fVar130;
      fVar89 = auVar96._4_4_ + auVar96._0_4_ + local_1cc;
      fVar90 = auVar60._4_4_ + auVar60._0_4_ + fStack_1c8;
      auVar83._4_4_ = fVar90;
      auVar83._0_4_ = fVar89;
      auVar214 = maxps(_local_418,auVar209);
      auVar83._8_4_ = auVar96._8_4_ + auVar96._4_4_ + fVar121;
      auVar83._12_4_ = auVar96._12_4_ + auVar60._4_4_ + fVar130;
      auVar60 = minps(auVar83,auVar194);
      iVar45 = -(uint)(auVar60._0_4_ < auVar214._0_4_);
      iVar47 = -(uint)(auVar60._4_4_ < auVar214._4_4_);
      auVar85._4_4_ = iVar47;
      auVar85._0_4_ = iVar45;
      auVar85._8_4_ = iVar47;
      auVar85._12_4_ = iVar47;
      auVar84._8_8_ = auVar85._8_8_;
      auVar84._4_4_ = iVar45;
      auVar84._0_4_ = iVar45;
      uVar44 = movmskpd((uint)(fVar108 < 0.0),auVar84);
      uVar39 = (ulong)uVar44;
      if (uVar44 == 0) {
        uVar39 = 0;
        if ((local_3e8 < auVar209._0_4_) && (fVar89 < fStack_3e4)) {
          iVar45 = -(uint)(fVar90 < fVar51);
          uVar39 = (ulong)CONCAT11((char)((uint)iVar45 >> 8),(byte)iVar45 & fVar109 < auVar209._4_4_
                                  );
        }
        if ((byte)((3 < (uint)uVar41 || fVar88 < 0.001) | (byte)uVar39) != 1) goto LAB_00a8f9f0;
        uVar39 = 200;
        do {
          fVar51 = 1.0 - local_1cc;
          fVar90 = local_1cc * local_1cc * local_1cc;
          fVar89 = local_1cc * local_1cc * 3.0 * fVar51;
          fVar109 = fVar51 * fVar51 * fVar51;
          fVar108 = local_1cc * 3.0 * fVar51 * fVar51;
          fVar51 = fVar109 * (float)local_1f8 +
                   fVar108 * local_2a8 + fVar89 * (float)local_2b8 + fVar90 * (float)local_3d8._0_4_
          ;
          fVar88 = fVar109 * local_1f8._4_4_ +
                   fVar108 * fStack_2a4 + fVar89 * local_2b8._4_4_ + fVar90 * (float)local_3d8._4_4_
          ;
          fVar51 = ((fVar109 * fStack_1f0 +
                    fVar108 * (float)uStack_2a0 + fVar89 * fStack_2b0 + fVar90 * fStack_3d0) -
                   fVar51) * fStack_1c8 + fVar51;
          fVar88 = ((fVar109 * fStack_1ec +
                    fVar108 * uStack_2a0._4_4_ + fVar89 * fStack_2ac + fVar90 * fStack_3cc) - fVar88
                   ) * fStack_1c8 + fVar88;
          local_1cc = local_1cc - (fVar88 * fVar123 + fVar51 * fVar129);
          fStack_1c8 = fStack_1c8 - (fVar88 * fVar128 + fVar51 * fVar145);
          fVar109 = ABS(fVar88);
          if (ABS(fVar88) <= ABS(fVar51)) {
            fVar109 = ABS(fVar51);
          }
          if (fVar109 < local_298) {
            if ((((0.0 <= local_1cc) && (local_1cc <= 1.0)) && (0.0 <= fStack_1c8)) &&
               (fStack_1c8 <= 1.0)) {
              fVar109 = (pre->ray_space).vx.field_0.m128[2];
              fVar51 = (pre->ray_space).vy.field_0.m128[2];
              fVar88 = (pre->ray_space).vz.field_0.m128[2];
              fVar89 = (ray->org).field_0.m128[0];
              fVar90 = (ray->org).field_0.m128[1];
              fVar108 = (ray->org).field_0.m128[2];
              fVar129 = 1.0 - fStack_1c8;
              fVar128 = 1.0 - local_1cc;
              fVar110 = fVar128 * fVar128 * fVar128;
              fVar120 = local_1cc * 3.0 * fVar128 * fVar128;
              fVar123 = local_1cc * local_1cc * local_1cc;
              fVar121 = local_1cc * local_1cc * 3.0 * fVar128;
              fVar109 = (((fStack_350 - fVar108) * fVar88 +
                         (fStack_354 - fVar90) * fVar51 + (local_358 - fVar89) * fVar109) * fVar129
                        + ((fStack_340 - fVar108) * fVar88 +
                          (fStack_344 - fVar90) * fVar51 + (local_348 - fVar89) * fVar109) *
                          fStack_1c8) * fVar110 +
                        (((fStack_360 - fVar108) * fVar88 +
                         (fStack_364 - fVar90) * fVar51 + (local_368 - fVar89) * fVar109) * fVar129
                        + ((fStack_200 - fVar108) * fVar88 +
                          (fStack_204 - fVar90) * fVar51 + (local_208 - fVar89) * fVar109) *
                          fStack_1c8) * fVar120 +
                        (((fStack_380 - fVar108) * fVar88 +
                         (fStack_384 - fVar90) * fVar51 + (local_388 - fVar89) * fVar109) * fVar129
                        + ((fStack_390 - fVar108) * fVar88 +
                          (fStack_394 - fVar90) * fVar51 + (local_398 - fVar89) * fVar109) *
                          fStack_1c8) * fVar121 +
                        (fVar129 * ((fStack_370 - fVar108) * fVar88 +
                                   (fStack_374 - fVar90) * fVar51 + (local_378 - fVar89) * fVar109)
                        + ((fStack_3b0 - fVar108) * fVar88 +
                          (fStack_3b4 - fVar90) * fVar51 + (local_3b8 - fVar89) * fVar109) *
                          fStack_1c8) * fVar123;
              if (((ray->org).field_0.m128[3] <= fVar109) && (fVar51 = ray->tfar, fVar109 <= fVar51)
                 ) {
                fVar108 = 1.0 - fStack_1c8;
                fVar129 = 1.0 - fStack_1c8;
                fVar130 = 1.0 - fStack_1c8;
                fVar88 = local_368 * fVar108 + local_208 * fStack_1c8;
                fVar89 = fStack_364 * fVar129 + fStack_204 * fStack_1c8;
                fVar90 = fStack_360 * fVar130 + fStack_200 * fStack_1c8;
                fVar143 = local_388 * fVar108 + local_398 * fStack_1c8;
                fVar145 = fStack_384 * fVar129 + fStack_394 * fStack_1c8;
                fVar159 = fStack_380 * fVar130 + fStack_390 * fStack_1c8;
                fVar144 = fVar143 - fVar88;
                fVar111 = fVar145 - fVar89;
                fVar160 = fVar159 - fVar90;
                fVar88 = (((fVar88 - (local_358 * fVar108 + local_348 * fStack_1c8)) * fVar128 +
                          local_1cc * fVar144) * fVar128 +
                         (fVar144 * fVar128 +
                         ((fVar108 * local_378 + fStack_1c8 * local_3b8) - fVar143) * local_1cc) *
                         local_1cc) * 3.0;
                fVar89 = (((fVar89 - (fStack_354 * fVar129 + fStack_344 * fStack_1c8)) * fVar128 +
                          local_1cc * fVar111) * fVar128 +
                         (fVar111 * fVar128 +
                         ((fVar129 * fStack_374 + fStack_1c8 * fStack_3b4) - fVar145) * local_1cc) *
                         local_1cc) * 3.0;
                fVar90 = (((fVar90 - (fStack_350 * fVar130 + fStack_340 * fStack_1c8)) * fVar128 +
                          local_1cc * fVar160) * fVar128 +
                         (fVar160 * fVar128 +
                         ((fVar130 * fStack_370 + fStack_1c8 * fStack_3b0) - fVar159) * local_1cc) *
                         local_1cc) * 3.0;
                pGVar5 = (context->scene->geometries).items[local_3c0].ptr;
                if ((pGVar5->mask & ray->mask) == 0) {
LAB_00a91076:
                  uVar39 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (uVar39 = CONCAT71((int7)(local_3c0 >> 8),1),
                        pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar108 = fVar110 * local_178 +
                            fVar120 * local_188 + fVar121 * local_198 + fVar123 * local_1a8;
                  fVar128 = fVar110 * fStack_174 +
                            fVar120 * fStack_184 + fVar121 * fStack_194 + fVar123 * fStack_1a4;
                  fVar110 = fVar110 * fStack_170 +
                            fVar120 * fStack_180 + fVar121 * fStack_190 + fVar123 * fStack_1a0;
                  local_1d8 = CONCAT44(fVar108 * fVar90 - fVar88 * fVar110,
                                       fVar110 * fVar89 - fVar90 * fVar128);
                  local_1d0 = fVar128 * fVar88 - fVar89 * fVar108;
                  local_1c4 = (int)local_280;
                  local_1c0 = (int)local_3c0;
                  local_1bc = context->user->instID[0];
                  local_1b8 = context->user->instPrimID[0];
                  ray->tfar = fVar109;
                  local_3ec = -1;
                  local_278.valid = &local_3ec;
                  local_278.geometryUserPtr = pGVar5->userPtr;
                  local_278.context = context->user;
                  local_278.ray = (RTCRayN *)ray;
                  local_278.hit = (RTCHitN *)&local_1d8;
                  local_278.N = 1;
                  if ((pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar5->occlusionFilterN)(&local_278), *local_278.valid != 0)) {
                    pRVar40 = context->args;
                    if ((pRVar40->filter == (RTCFilterFunctionN)0x0) ||
                       ((((pRVar40->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar5->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*pRVar40->filter)(&local_278), *local_278.valid != 0)))) {
                      uVar39 = CONCAT71((int7)((ulong)pRVar40 >> 8),1);
                      goto LAB_00a91078;
                    }
                  }
                  ray->tfar = fVar51;
                  goto LAB_00a91076;
                }
LAB_00a91078:
                bVar36 = (bool)(bVar36 | (byte)uVar39);
              }
            }
            break;
          }
          uVar39 = uVar39 - 1;
        } while (uVar39 != 0);
      }
    }
  }
  goto LAB_00a9005e;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }